

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_avx2_256_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m256i alVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i alVar14;
  __m256i alVar15;
  __m256i alVar16;
  __m256i alVar17;
  __m256i c;
  __m256i c_00;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [24];
  undefined1 auVar31 [24];
  undefined1 auVar32 [24];
  undefined1 auVar33 [24];
  undefined1 auVar34 [24];
  undefined1 auVar35 [24];
  undefined1 auVar36 [24];
  undefined1 auVar37 [24];
  undefined1 auVar38 [24];
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  int iVar44;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  __m256i vHL_1;
  __m256i vHS_1;
  __m256i vHM_1;
  __m256i vH_1;
  __m256i vFtL;
  __m256i vFtS;
  __m256i vFtM;
  __m256i vFt;
  __m256i vGapperL_1;
  __m256i vGapper_1;
  __m256i case2;
  __m256i case1;
  __m256i vWS;
  __m256i *pvWS;
  __m256i vWM;
  __m256i *pvWM;
  __m256i vW;
  __m256i *pvW;
  __m256i vHpL;
  __m256i vHpS;
  __m256i vHpM;
  __m256i vHp;
  __m256i vHL;
  __m256i vHS;
  __m256i vHM;
  __m256i vH;
  __m256i vFL;
  __m256i vFS;
  __m256i vFM;
  __m256i vF_opn;
  __m256i vF_ext;
  __m256i vF;
  __m256i vHtL;
  __m256i vHtS;
  __m256i vHtM;
  __m256i vHt;
  __m256i vEL;
  __m256i vES;
  __m256i vEM;
  __m256i vE_opn;
  __m256i vE_ext;
  __m256i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_16_t h;
  int32_t segNum;
  int32_t index;
  __m256i vGapperL;
  __m256i vGapper;
  parasail_result_t *result;
  __m256i vSegLen;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int16_t length;
  int16_t similar;
  int16_t matches;
  int16_t score;
  __m256i vOne;
  __m256i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  int16_t *boundary;
  __m256i *pvGapperL;
  __m256i *pvGapper;
  __m256i *pvHLMax;
  __m256i *pvHSMax;
  __m256i *pvHMMax;
  __m256i *pvHMax;
  __m256i *pvHL;
  __m256i *pvHS;
  __m256i *pvHM;
  __m256i *pvH;
  __m256i *pvEL;
  __m256i *pvES;
  __m256i *pvEM;
  __m256i *pvE;
  __m256i *pvPs;
  __m256i *pvPm;
  __m256i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  size_t in_stack_ffffffffffffd7b0;
  undefined8 in_stack_ffffffffffffd7b8;
  undefined6 in_stack_ffffffffffffd7c0;
  undefined2 uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  __m256i *local_2820;
  short sStack_2802;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  __m256i local_25e0;
  __m256i local_25c0;
  __m256i local_25a0;
  __m256i local_2580;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [8];
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  longlong local_23a0;
  longlong lStack_2398;
  longlong lStack_2390;
  longlong lStack_2388;
  longlong local_2380;
  longlong lStack_2378;
  longlong lStack_2370;
  longlong lStack_2368;
  longlong local_2360;
  longlong lStack_2358;
  longlong lStack_2350;
  longlong lStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  longlong local_2300;
  longlong lStack_22f8;
  longlong lStack_22f0;
  longlong lStack_22e8;
  longlong local_22c0;
  longlong lStack_22b8;
  longlong lStack_22b0;
  longlong lStack_22a8;
  int local_2288;
  int local_2284;
  undefined1 local_2280 [32];
  undefined1 local_2260 [32];
  parasail_result_t *local_2228;
  undefined1 local_2220 [32];
  undefined1 local_2200 [32];
  undefined1 local_21e0 [32];
  undefined1 local_21c0 [32];
  undefined1 local_21a0 [32];
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  short local_2128;
  short local_2126;
  short local_2124;
  ushort local_2122;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  ulong uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  ushort local_20c4;
  ushort local_20c2;
  undefined1 local_20c0 [16];
  undefined1 auStack_20b0 [16];
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  int16_t *local_2080;
  __m256i *local_2078;
  __m256i *local_2070;
  __m256i *local_2068;
  __m256i *local_2060;
  __m256i *local_2058;
  __m256i *local_2050;
  __m256i *local_2048;
  __m256i *local_2040;
  __m256i *local_2038;
  __m256i *local_2030;
  __m256i *local_2028;
  __m256i *local_2020;
  __m256i *local_2018;
  __m256i *local_2010;
  long local_2008;
  long local_2000;
  long local_1ff8;
  int local_1ff0;
  int local_1fec;
  uint local_1fe8;
  int local_1fe4;
  long local_1fe0;
  int local_1fd4;
  int local_1fd0;
  int local_1fcc;
  int local_1fc8;
  int local_1fc4;
  uint local_1fc0;
  uint local_1fbc;
  uint local_1fb8;
  int local_1fb4;
  long local_1fb0;
  parasail_result_t *local_1fa0;
  ushort local_1f96;
  ushort local_1f94;
  ushort local_1f92;
  ushort local_1f90;
  ushort local_1f8e;
  ushort local_1f8c;
  ushort local_1f8a;
  ushort local_1f88;
  undefined2 local_1f86;
  ushort local_1f84;
  ushort local_1f82;
  undefined1 local_1f80 [32];
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  longlong local_1e60;
  longlong lStack_1e58;
  longlong lStack_1e50;
  longlong lStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  longlong lStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  longlong local_1dc0;
  longlong lStack_1db8;
  longlong lStack_1db0;
  longlong lStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  longlong local_1d80;
  longlong lStack_1d78;
  longlong lStack_1d70;
  longlong lStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  longlong local_1d40;
  longlong lStack_1d38;
  longlong lStack_1d30;
  longlong lStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  longlong local_1d00;
  longlong lStack_1cf8;
  longlong lStack_1cf0;
  longlong lStack_1ce8;
  longlong local_1ce0;
  longlong lStack_1cd8;
  longlong lStack_1cd0;
  longlong lStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  longlong lStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  longlong local_1c00;
  longlong lStack_1bf8;
  longlong lStack_1bf0;
  longlong lStack_1be8;
  undefined1 local_1be0 [32];
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined1 local_1ba0 [16];
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined1 local_1b20 [16];
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  longlong lStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  longlong lStack_1aa8;
  longlong local_1aa0;
  longlong lStack_1a98;
  longlong lStack_1a90;
  longlong lStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined1 local_1a60 [16];
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  longlong local_1a40;
  longlong lStack_1a38;
  longlong lStack_1a30;
  longlong lStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  ulong uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  longlong local_19e0;
  longlong lStack_19d8;
  longlong lStack_19d0;
  longlong lStack_19c8;
  __m256i *local_19a8;
  longlong local_19a0;
  longlong lStack_1998;
  longlong lStack_1990;
  longlong lStack_1988;
  __m256i *local_1968;
  longlong local_1960;
  longlong lStack_1958;
  longlong lStack_1950;
  longlong lStack_1948;
  __m256i *local_1928;
  longlong local_1920;
  longlong lStack_1918;
  longlong lStack_1910;
  longlong lStack_1908;
  __m256i *local_18e8;
  longlong local_18e0;
  longlong lStack_18d8;
  longlong lStack_18d0;
  longlong lStack_18c8;
  __m256i *local_18a8;
  longlong local_18a0;
  longlong lStack_1898;
  longlong lStack_1890;
  longlong lStack_1888;
  __m256i *local_1868;
  longlong local_1860;
  longlong lStack_1858;
  longlong lStack_1850;
  longlong lStack_1848;
  __m256i *local_1828;
  longlong local_1820;
  longlong lStack_1818;
  longlong lStack_1810;
  longlong lStack_1808;
  __m256i *local_17e8;
  longlong local_17e0;
  longlong lStack_17d8;
  longlong lStack_17d0;
  longlong lStack_17c8;
  __m256i *local_17a8;
  longlong local_17a0;
  longlong lStack_1798;
  longlong lStack_1790;
  longlong lStack_1788;
  __m256i *local_1768;
  longlong local_1760;
  longlong lStack_1758;
  longlong lStack_1750;
  longlong lStack_1748;
  __m256i *local_1728;
  longlong local_1720;
  longlong lStack_1718;
  longlong lStack_1710;
  longlong lStack_1708;
  __m256i *local_16e8;
  __m256i *local_16a8;
  longlong local_16a0;
  longlong lStack_1698;
  longlong lStack_1690;
  longlong lStack_1688;
  __m256i *local_1668;
  longlong local_1660;
  longlong lStack_1658;
  longlong lStack_1650;
  longlong lStack_1648;
  __m256i *local_1640;
  __m256i *local_1638;
  __m256i *local_1630;
  __m256i *local_1628;
  __m256i *local_1620;
  __m256i *local_1618;
  __m256i *local_1610;
  __m256i *local_1608;
  __m256i *local_1600;
  __m256i *local_15f8;
  __m256i *local_15f0;
  __m256i *local_15e8;
  __m256i *local_15e0;
  __m256i *local_15d8;
  __m256i *local_15d0;
  __m256i *local_15c8;
  __m256i *local_15c0;
  undefined1 (*local_15b8) [32];
  undefined1 (*local_15b0) [32];
  undefined1 (*local_15a8) [32];
  __m256i *local_15a0;
  __m256i *local_1598;
  __m256i *local_1590;
  __m256i *local_1588;
  __m256i *local_1580;
  __m256i *local_1578;
  __m256i *local_1570;
  __m256i *local_1568;
  __m256i *local_1560;
  __m256i *local_1558;
  __m256i *local_1550;
  __m256i *local_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  longlong local_13c0;
  longlong lStack_13b8;
  longlong lStack_13b0;
  longlong lStack_13a8;
  longlong local_13a0;
  longlong lStack_1398;
  longlong lStack_1390;
  longlong lStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  longlong local_1300;
  longlong lStack_12f8;
  longlong lStack_12f0;
  longlong lStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  longlong local_12c0;
  longlong lStack_12b8;
  longlong lStack_12b0;
  longlong lStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  longlong local_1280;
  longlong lStack_1278;
  longlong lStack_1270;
  longlong lStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  longlong local_1240;
  longlong lStack_1238;
  longlong lStack_1230;
  longlong lStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  longlong lStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  longlong lStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  longlong local_1080;
  longlong lStack_1078;
  longlong lStack_1070;
  longlong lStack_1068;
  longlong local_1060;
  longlong lStack_1058;
  longlong lStack_1050;
  longlong lStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  longlong lStack_f88;
  undefined1 local_f80 [32];
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  longlong lStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  longlong lStack_ec8;
  undefined1 local_ec0 [32];
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  longlong lStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  longlong lStack_e08;
  undefined1 local_e00 [32];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  longlong lStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined1 local_b20 [32];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [32];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  longlong local_8e0;
  longlong lStack_8d8;
  longlong lStack_8d0;
  longlong lStack_8c8;
  longlong local_8c0;
  longlong lStack_8b8;
  longlong lStack_8b0;
  longlong lStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  longlong local_880;
  longlong lStack_878;
  longlong lStack_870;
  longlong lStack_868;
  longlong local_860;
  longlong lStack_858;
  longlong lStack_850;
  longlong lStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  longlong local_820;
  longlong lStack_818;
  longlong lStack_810;
  longlong lStack_808;
  longlong local_800;
  longlong lStack_7f8;
  longlong lStack_7f0;
  longlong lStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [32];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  longlong lStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  longlong lStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  longlong lStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  longlong lStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  longlong lStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  longlong lStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  longlong local_480;
  longlong lStack_478;
  longlong lStack_470;
  longlong lStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  longlong lStack_448;
  longlong local_440;
  longlong lStack_438;
  longlong lStack_430;
  longlong lStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  longlong local_360;
  longlong lStack_358;
  longlong lStack_350;
  longlong lStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  ushort local_2e0;
  ushort local_2de;
  ushort local_2dc;
  ushort local_2da;
  ushort local_2d8;
  ushort local_2d6;
  ushort local_2d4;
  ushort local_2d2;
  ushort local_2d0;
  ushort local_2ce;
  ushort local_2cc;
  ushort local_2ca;
  ushort local_2c8;
  ushort local_2c6;
  ushort local_2c4;
  ushort local_2c2;
  undefined1 local_2c0 [32];
  ushort local_2a0;
  ushort local_29e;
  ushort local_29c;
  ushort local_29a;
  ushort local_298;
  ushort local_296;
  ushort local_294;
  ushort local_292;
  ushort local_290;
  ushort local_28e;
  ushort local_28c;
  ushort local_28a;
  ushort local_288;
  ushort local_286;
  ushort local_284;
  ushort local_282;
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined2 local_260;
  undefined2 local_25e;
  undefined2 local_25c;
  undefined2 local_25a;
  undefined2 local_258;
  undefined2 local_256;
  undefined2 local_254;
  undefined2 local_252;
  undefined2 local_250;
  undefined2 local_24e;
  undefined2 local_24c;
  undefined2 local_24a;
  undefined2 local_248;
  undefined2 local_246;
  undefined2 local_244;
  undefined2 local_242;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  ushort local_220;
  ushort local_21e;
  ushort local_21c;
  ushort local_21a;
  ushort local_218;
  ushort local_216;
  ushort local_214;
  ushort local_212;
  ushort local_210;
  ushort local_20e;
  ushort local_20c;
  ushort local_20a;
  ushort local_208;
  ushort local_206;
  ushort local_204;
  ushort local_202;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  ushort local_1e0;
  ushort local_1de;
  ushort local_1dc;
  ushort local_1da;
  ushort local_1d8;
  ushort local_1d6;
  ushort local_1d4;
  ushort local_1d2;
  ushort local_1d0;
  ushort local_1ce;
  ushort local_1cc;
  ushort local_1ca;
  ushort local_1c8;
  ushort local_1c6;
  ushort local_1c4;
  ushort local_1c2;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  ushort local_1a0;
  ushort local_19e;
  ushort local_19c;
  ushort local_19a;
  ushort local_198;
  ushort local_196;
  ushort local_194;
  ushort local_192;
  ushort local_190;
  ushort local_18e;
  ushort local_18c;
  ushort local_18a;
  ushort local_188;
  ushort local_186;
  ushort local_184;
  ushort local_182;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  ushort local_160;
  ushort local_15e;
  ushort local_15c;
  ushort local_15a;
  ushort local_158;
  ushort local_156;
  ushort local_154;
  ushort local_152;
  ushort local_150;
  ushort local_14e;
  ushort local_14c;
  ushort local_14a;
  ushort local_148;
  ushort local_146;
  ushort local_144;
  ushort local_142;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  ushort local_120;
  ushort local_11e;
  ushort local_11c;
  ushort local_11a;
  ushort local_118;
  ushort local_116;
  ushort local_114;
  ushort local_112;
  ushort local_110;
  ushort local_10e;
  ushort local_10c;
  ushort local_10a;
  ushort local_108;
  ushort local_106;
  ushort local_104;
  ushort local_102;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  ushort local_e0;
  ushort local_de;
  ushort local_dc;
  ushort local_da;
  ushort local_d8;
  ushort local_d6;
  ushort local_d4;
  ushort local_d2;
  ushort local_d0;
  ushort local_ce;
  ushort local_cc;
  ushort local_ca;
  ushort local_c8;
  ushort local_c6;
  ushort local_c4;
  ushort local_c2;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  ushort local_a0;
  ushort local_9e;
  ushort local_9c;
  ushort local_9a;
  ushort local_98;
  ushort local_96;
  ushort local_94;
  ushort local_92;
  ushort local_90;
  ushort local_8e;
  ushort local_8c;
  ushort local_8a;
  ushort local_88;
  ushort local_86;
  ushort local_84;
  ushort local_82;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  ushort local_48;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  ushort local_40;
  ushort local_3e;
  ushort local_3c;
  ushort local_3a;
  ushort local_38;
  ushort local_36;
  ushort local_34;
  ushort local_32;
  
  local_1fc0 = 0;
  local_1fc4 = 0;
  local_1fc8 = 0;
  local_1fcc = 0;
  local_1fd0 = 0;
  local_1fd4 = 0;
  local_1fe0 = 0;
  local_1fe4 = 0;
  local_1fe8 = 0;
  local_1fec = 0;
  local_1ff0 = 0;
  local_1ff8 = 0;
  local_2000 = 0;
  local_2008 = 0;
  local_2010 = (__m256i *)0x0;
  local_2018 = (__m256i *)0x0;
  local_2020 = (__m256i *)0x0;
  local_2028 = (__m256i *)0x0;
  local_2030 = (__m256i *)0x0;
  local_2038 = (__m256i *)0x0;
  local_2040 = (__m256i *)0x0;
  local_2048 = (__m256i *)0x0;
  local_2050 = (__m256i *)0x0;
  local_2058 = (__m256i *)0x0;
  local_2060 = (__m256i *)0x0;
  local_2068 = (__m256i *)0x0;
  local_2070 = (__m256i *)0x0;
  local_2078 = (__m256i *)0x0;
  local_2080 = (int16_t *)0x0;
  local_20c2 = 0;
  local_20c4 = 0;
  local_2122 = 0;
  local_2124 = 0;
  local_2126 = 0;
  local_2128 = 0;
  local_2228 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_avx2_256_16","profile");
    local_1fa0 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x30) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_avx2_256_16",
            "profile->profile16.score");
    local_1fa0 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_avx2_256_16",
            "profile->matrix");
    local_1fa0 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_scan_profile_avx2_256_16",
            "profile->s1Len");
    local_1fa0 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_avx2_256_16","s2");
    local_1fa0 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_scan_profile_avx2_256_16","s2Len");
    local_1fa0 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_scan_profile_avx2_256_16","open");
    local_1fa0 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_scan_profile_avx2_256_16","gap");
    local_1fa0 = (parasail_result_t *)0x0;
  }
  else {
    local_1fc0 = 0;
    local_1fc4 = 0;
    local_1fc8 = 0;
    local_1fcc = *(int *)(in_RDI + 8);
    local_1fd0 = local_1fcc + -1;
    local_1fd4 = in_EDX + -1;
    local_1fe0 = *(long *)(in_RDI + 0x10);
    local_1fe4 = 0x10;
    local_1fe8 = (local_1fcc + 0xf) / 0x10;
    local_1fec = (local_1fcc + -1) % (int)local_1fe8;
    local_1ff0 = ~((local_1fcc + -1) / (int)local_1fe8) + 0x10;
    local_1ff8 = *(long *)(in_RDI + 0x30);
    local_2000 = *(long *)(in_RDI + 0x38);
    local_2008 = *(long *)(in_RDI + 0x40);
    local_1fb8._0_2_ = (ushort)in_ECX;
    local_1f82 = (ushort)local_1fb8;
    local_2c2 = (ushort)local_1fb8;
    local_2c4 = (ushort)local_1fb8;
    local_2c6 = (ushort)local_1fb8;
    local_2c8 = (ushort)local_1fb8;
    local_2ca = (ushort)local_1fb8;
    local_2cc = (ushort)local_1fb8;
    local_2ce = (ushort)local_1fb8;
    local_2d0 = (ushort)local_1fb8;
    local_2d2 = (ushort)local_1fb8;
    local_2d4 = (ushort)local_1fb8;
    local_2d6 = (ushort)local_1fb8;
    local_2d8 = (ushort)local_1fb8;
    local_2da = (ushort)local_1fb8;
    local_2dc = (ushort)local_1fb8;
    local_2de = (ushort)local_1fb8;
    local_2e0 = (ushort)local_1fb8;
    auVar3 = vpinsrw_avx(ZEXT216((ushort)local_1fb8),in_ECX & 0xffff,1);
    auVar3 = vpinsrw_avx(auVar3,in_ECX & 0xffff,2);
    auVar3 = vpinsrw_avx(auVar3,in_ECX & 0xffff,3);
    auVar3 = vpinsrw_avx(auVar3,in_ECX & 0xffff,4);
    auVar3 = vpinsrw_avx(auVar3,in_ECX & 0xffff,5);
    auVar3 = vpinsrw_avx(auVar3,in_ECX & 0xffff,6);
    local_300 = vpinsrw_avx(auVar3,in_ECX & 0xffff,7);
    auVar3 = vpinsrw_avx(ZEXT216((ushort)local_1fb8),in_ECX & 0xffff,1);
    auVar3 = vpinsrw_avx(auVar3,in_ECX & 0xffff,2);
    auVar3 = vpinsrw_avx(auVar3,in_ECX & 0xffff,3);
    auVar3 = vpinsrw_avx(auVar3,in_ECX & 0xffff,4);
    auVar3 = vpinsrw_avx(auVar3,in_ECX & 0xffff,5);
    auVar3 = vpinsrw_avx(auVar3,in_ECX & 0xffff,6);
    auStack_2f0 = vpinsrw_avx(auVar3,in_ECX & 0xffff,7);
    local_20a0 = local_300._0_8_;
    uStack_2098 = local_300._8_8_;
    uStack_2090 = auStack_2f0._0_8_;
    uStack_2088 = auStack_2f0._8_8_;
    local_1fbc._0_2_ = (ushort)in_R8D;
    local_1f84 = (ushort)local_1fbc;
    local_282 = (ushort)local_1fbc;
    local_284 = (ushort)local_1fbc;
    local_286 = (ushort)local_1fbc;
    local_288 = (ushort)local_1fbc;
    local_28a = (ushort)local_1fbc;
    local_28c = (ushort)local_1fbc;
    local_28e = (ushort)local_1fbc;
    local_290 = (ushort)local_1fbc;
    local_292 = (ushort)local_1fbc;
    local_294 = (ushort)local_1fbc;
    local_296 = (ushort)local_1fbc;
    local_298 = (ushort)local_1fbc;
    local_29a = (ushort)local_1fbc;
    local_29c = (ushort)local_1fbc;
    local_29e = (ushort)local_1fbc;
    local_2a0 = (ushort)local_1fbc;
    auVar3 = vpinsrw_avx(ZEXT216((ushort)local_1fbc),in_R8D & 0xffff,1);
    auVar3 = vpinsrw_avx(auVar3,in_R8D & 0xffff,2);
    auVar3 = vpinsrw_avx(auVar3,in_R8D & 0xffff,3);
    auVar3 = vpinsrw_avx(auVar3,in_R8D & 0xffff,4);
    auVar3 = vpinsrw_avx(auVar3,in_R8D & 0xffff,5);
    auVar3 = vpinsrw_avx(auVar3,in_R8D & 0xffff,6);
    auVar3 = vpinsrw_avx(auVar3,in_R8D & 0xffff,7);
    auVar4 = vpinsrw_avx(ZEXT216((ushort)local_1fbc),in_R8D & 0xffff,1);
    auVar4 = vpinsrw_avx(auVar4,in_R8D & 0xffff,2);
    auVar4 = vpinsrw_avx(auVar4,in_R8D & 0xffff,3);
    auVar4 = vpinsrw_avx(auVar4,in_R8D & 0xffff,4);
    auVar4 = vpinsrw_avx(auVar4,in_R8D & 0xffff,5);
    auVar4 = vpinsrw_avx(auVar4,in_R8D & 0xffff,6);
    auVar4 = vpinsrw_avx(auVar4,in_R8D & 0xffff,7);
    local_2c0._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
    local_2c0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
    if (*(int *)(local_1fe0 + 0x20) <= (int)-in_ECX) {
      local_1fb8._0_2_ = -(short)*(undefined4 *)(local_1fe0 + 0x20);
    }
    uVar39 = (ushort)local_1fb8 + 0x8001;
    uVar40 = ((ushort)*(undefined4 *)(local_1fe0 + 0x1c) ^ 0x7fff) - 1;
    local_1f80._8_8_ = SUB328(ZEXT832(0),4);
    local_2100 = 0;
    uStack_20f8 = local_1f80._8_8_;
    uStack_20f0 = 0;
    uStack_20e8 = 0;
    local_1f86 = 1;
    uVar45 = 1;
    local_242 = 1;
    local_244 = 1;
    local_246 = 1;
    local_248 = 1;
    local_24a = 1;
    local_24c = 1;
    local_24e = 1;
    local_250 = 1;
    local_252 = 1;
    local_254 = 1;
    local_256 = 1;
    local_258 = 1;
    local_25a = 1;
    local_25c = 1;
    local_25e = 1;
    local_260 = 1;
    auVar3 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar3 = vpinsrw_avx(auVar3,1,2);
    auVar3 = vpinsrw_avx(auVar3,1,3);
    auVar3 = vpinsrw_avx(auVar3,1,4);
    auVar3 = vpinsrw_avx(auVar3,1,5);
    auVar3 = vpinsrw_avx(auVar3,1,6);
    local_280 = vpinsrw_avx(auVar3,1,7);
    auVar3 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar3 = vpinsrw_avx(auVar3,1,2);
    auVar3 = vpinsrw_avx(auVar3,1,3);
    auVar3 = vpinsrw_avx(auVar3,1,4);
    auVar3 = vpinsrw_avx(auVar3,1,5);
    auVar3 = vpinsrw_avx(auVar3,1,6);
    auStack_270 = vpinsrw_avx(auVar3,1,7);
    local_2120 = local_280._0_8_;
    uStack_2118 = local_280._8_8_;
    uStack_2110 = auStack_270._0_8_;
    uStack_2108 = auStack_270._8_8_;
    local_2124 = 0;
    local_2126 = 0;
    local_2128 = 0;
    auVar3 = vpinsrw_avx(ZEXT216(uVar39),(uint)uVar39,1);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar39,2);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar39,3);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar39,4);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar39,5);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar39,6);
    local_240 = vpinsrw_avx(auVar3,(uint)uVar39,7);
    auVar3 = vpinsrw_avx(ZEXT216(uVar39),(uint)uVar39,1);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar39,2);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar39,3);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar39,4);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar39,5);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar39,6);
    auStack_230 = vpinsrw_avx(auVar3,(uint)uVar39,7);
    local_2160 = local_240._0_8_;
    uStack_2158 = local_240._8_8_;
    uStack_2150 = auStack_230._0_8_;
    uStack_2148 = auStack_230._8_8_;
    auVar3 = vpinsrw_avx(ZEXT216(uVar40),(uint)uVar40,1);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar40,2);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar40,3);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar40,4);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar40,5);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar40,6);
    local_200 = vpinsrw_avx(auVar3,(uint)uVar40,7);
    auVar3 = vpinsrw_avx(ZEXT216(uVar40),(uint)uVar40,1);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar40,2);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar40,3);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar40,4);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar40,5);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar40,6);
    auStack_1f0 = vpinsrw_avx(auVar3,(uint)uVar40,7);
    local_2180 = local_200._0_8_;
    uStack_2178 = local_200._8_8_;
    uStack_2170 = auStack_1f0._0_8_;
    uStack_2168 = auStack_1f0._8_8_;
    local_21a0._16_8_ = auStack_1f0._0_8_;
    local_21a0._0_16_ = local_200;
    local_21a0._24_8_ = auStack_1f0._8_8_;
    local_21c0._16_8_ = auStack_230._0_8_;
    local_21c0._0_16_ = local_240;
    local_21c0._24_8_ = auStack_230._8_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_1f80._8_8_;
    local_21e0._0_16_ = auVar3 << 0x40;
    auVar4 = local_21e0._0_16_;
    local_21e0 = ZEXT832((ulong)local_1f80._8_8_) << 0x40;
    local_1f8c = (ushort)local_1fe8;
    local_182 = (ushort)local_1fe8;
    local_184 = (ushort)local_1fe8;
    local_186 = (ushort)local_1fe8;
    local_188 = (ushort)local_1fe8;
    local_18a = (ushort)local_1fe8;
    local_18c = (ushort)local_1fe8;
    local_18e = (ushort)local_1fe8;
    local_190 = (ushort)local_1fe8;
    local_192 = (ushort)local_1fe8;
    local_194 = (ushort)local_1fe8;
    local_196 = (ushort)local_1fe8;
    local_198 = (ushort)local_1fe8;
    local_19a = (ushort)local_1fe8;
    local_19c = (ushort)local_1fe8;
    local_19e = (ushort)local_1fe8;
    local_1a0 = (ushort)local_1fe8;
    auVar3 = vpinsrw_avx(ZEXT216((ushort)local_1fe8),local_1fe8 & 0xffff,1);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,2);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,3);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,4);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,5);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,6);
    local_1c0 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,7);
    auVar3 = vpinsrw_avx(ZEXT216((ushort)local_1fe8),local_1fe8 & 0xffff,1);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,2);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,3);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,4);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,5);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,6);
    auStack_1b0 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,7);
    auVar13._16_16_ = auStack_1b0;
    auVar13._0_16_ = local_1c0;
    local_1f8e = (ushort)local_1fe8;
    local_142 = (ushort)local_1fe8;
    local_144 = (ushort)local_1fe8;
    local_146 = (ushort)local_1fe8;
    local_148 = (ushort)local_1fe8;
    local_14a = (ushort)local_1fe8;
    local_14c = (ushort)local_1fe8;
    local_14e = (ushort)local_1fe8;
    local_150 = (ushort)local_1fe8;
    local_152 = (ushort)local_1fe8;
    local_154 = (ushort)local_1fe8;
    local_156 = (ushort)local_1fe8;
    local_158 = (ushort)local_1fe8;
    local_15a = (ushort)local_1fe8;
    local_15c = (ushort)local_1fe8;
    local_15e = (ushort)local_1fe8;
    local_160 = (ushort)local_1fe8;
    auVar3 = vpinsrw_avx(ZEXT216((ushort)local_1fe8),local_1fe8 & 0xffff,1);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,2);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,3);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,4);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,5);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,6);
    local_180 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,7);
    auVar3 = vpinsrw_avx(ZEXT216((ushort)local_1fe8),local_1fe8 & 0xffff,1);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,2);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,3);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,4);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,5);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,6);
    auStack_170 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,7);
    auVar12._16_16_ = auStack_170;
    auVar12._0_16_ = local_180;
    local_1f90 = (ushort)local_1fe8;
    local_102 = (ushort)local_1fe8;
    local_104 = (ushort)local_1fe8;
    local_106 = (ushort)local_1fe8;
    local_108 = (ushort)local_1fe8;
    local_10a = (ushort)local_1fe8;
    local_10c = (ushort)local_1fe8;
    local_10e = (ushort)local_1fe8;
    local_110 = (ushort)local_1fe8;
    local_112 = (ushort)local_1fe8;
    local_114 = (ushort)local_1fe8;
    local_116 = (ushort)local_1fe8;
    local_118 = (ushort)local_1fe8;
    local_11a = (ushort)local_1fe8;
    local_11c = (ushort)local_1fe8;
    local_11e = (ushort)local_1fe8;
    local_120 = (ushort)local_1fe8;
    auVar3 = vpinsrw_avx(ZEXT216((ushort)local_1fe8),local_1fe8 & 0xffff,1);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,2);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,3);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,4);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,5);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,6);
    local_140 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,7);
    auVar3 = vpinsrw_avx(ZEXT216((ushort)local_1fe8),local_1fe8 & 0xffff,1);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,2);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,3);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,4);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,5);
    auVar3 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,6);
    local_130 = vpinsrw_avx(auVar3,local_1fe8 & 0xffff,7);
    auVar12 = vperm2i128_avx2(ZEXT1632(local_140),auVar12,0x28);
    local_2220 = vpalignr_avx2(auVar13,auVar12,0xe);
    auVar3 = vpinsrw_avx(auVar4,(uint)uVar39,0);
    local_21e0 = vblendps_avx(local_21e0,ZEXT1632(auVar3),0xf);
    uVar41 = -(ushort)local_1fe8 * (ushort)local_1fbc;
    auVar3 = vpinsrw_avx(ZEXT216(uVar41),(uint)uVar41,1);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar41,2);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar41,3);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar41,4);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar41,5);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar41,6);
    local_100 = vpinsrw_avx(auVar3,(uint)uVar41,7);
    auVar3 = vpinsrw_avx(ZEXT216(uVar41),(uint)uVar41,1);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar41,2);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar41,3);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar41,4);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar41,5);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar41,6);
    auStack_f0 = vpinsrw_avx(auVar3,(uint)uVar41,7);
    auVar11._16_16_ = auStack_f0;
    auVar11._0_16_ = local_100;
    uVar42 = -(ushort)local_1fe8 * (ushort)local_1fbc;
    auVar3 = vpinsrw_avx(ZEXT216(uVar42),(uint)uVar42,1);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar42,2);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar42,3);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar42,4);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar42,5);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar42,6);
    local_c0 = vpinsrw_avx(auVar3,(uint)uVar42,7);
    auVar3 = vpinsrw_avx(ZEXT216(uVar42),(uint)uVar42,1);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar42,2);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar42,3);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar42,4);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar42,5);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar42,6);
    auStack_b0 = vpinsrw_avx(auVar3,(uint)uVar42,7);
    auVar6._16_16_ = auStack_b0;
    auVar6._0_16_ = local_c0;
    uVar43 = -(ushort)local_1fe8 * (ushort)local_1fbc;
    auVar3 = vpinsrw_avx(ZEXT216(uVar43),(uint)uVar43,1);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar43,2);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar43,3);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar43,4);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar43,5);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar43,6);
    local_80 = vpinsrw_avx(auVar3,(uint)uVar43,7);
    auVar3 = vpinsrw_avx(ZEXT216(uVar43),(uint)uVar43,1);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar43,2);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar43,3);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar43,4);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar43,5);
    auVar3 = vpinsrw_avx(auVar3,(uint)uVar43,6);
    local_70 = vpinsrw_avx(auVar3,(uint)uVar43,7);
    auVar12 = vperm2i128_avx2(ZEXT1632(local_80),auVar6,0x28);
    local_1be0 = vpalignr_avx2(auVar11,auVar12,0xe);
    local_1bc0 = local_21e0._0_8_;
    uStack_1bb8 = local_21e0._8_8_;
    uStack_1bb0 = local_21e0._16_8_;
    uStack_1ba8 = local_21e0._24_8_;
    local_2200 = vpaddsw_avx2(local_21e0,local_1be0);
    uVar46 = (ushort)local_1fe8;
    uVar47 = (ushort)local_1fe8;
    uVar48 = (ushort)local_1fe8;
    local_2122 = uVar39;
    local_20c4 = uVar40;
    local_20c2 = uVar39;
    local_1fbc = in_R8D;
    local_1fb8 = in_ECX;
    local_1fb4 = in_EDX;
    local_1fb0 = in_RSI;
    local_1f96 = uVar43;
    local_1f94 = uVar42;
    local_1f92 = uVar41;
    local_1f8a = uVar40;
    local_1f88 = uVar39;
    local_1f80 = ZEXT832(0) << 0x20;
    local_220 = uVar39;
    local_21e = uVar39;
    local_21c = uVar39;
    local_21a = uVar39;
    local_218 = uVar39;
    local_216 = uVar39;
    local_214 = uVar39;
    local_212 = uVar39;
    local_210 = uVar39;
    local_20e = uVar39;
    local_20c = uVar39;
    local_20a = uVar39;
    local_208 = uVar39;
    local_206 = uVar39;
    local_204 = uVar39;
    local_202 = uVar39;
    local_1e0 = uVar40;
    local_1de = uVar40;
    local_1dc = uVar40;
    local_1da = uVar40;
    local_1d8 = uVar40;
    local_1d6 = uVar40;
    local_1d4 = uVar40;
    local_1d2 = uVar40;
    local_1d0 = uVar40;
    local_1ce = uVar40;
    local_1cc = uVar40;
    local_1ca = uVar40;
    local_1c8 = uVar40;
    local_1c6 = uVar40;
    local_1c4 = uVar40;
    local_1c2 = uVar40;
    local_e0 = uVar41;
    local_de = uVar41;
    local_dc = uVar41;
    local_da = uVar41;
    local_d8 = uVar41;
    local_d6 = uVar41;
    local_d4 = uVar41;
    local_d2 = uVar41;
    local_d0 = uVar41;
    local_ce = uVar41;
    local_cc = uVar41;
    local_ca = uVar41;
    local_c8 = uVar41;
    local_c6 = uVar41;
    local_c4 = uVar41;
    local_c2 = uVar41;
    local_a0 = uVar42;
    local_9e = uVar42;
    local_9c = uVar42;
    local_9a = uVar42;
    local_98 = uVar42;
    local_96 = uVar42;
    local_94 = uVar42;
    local_92 = uVar42;
    local_90 = uVar42;
    local_8e = uVar42;
    local_8c = uVar42;
    local_8a = uVar42;
    local_88 = uVar42;
    local_86 = uVar42;
    local_84 = uVar42;
    local_82 = uVar42;
    local_50 = uVar43;
    local_4e = uVar43;
    local_4c = uVar43;
    local_4a = uVar43;
    local_48 = uVar43;
    local_46 = uVar43;
    local_44 = uVar43;
    local_42 = uVar43;
    local_40 = uVar43;
    local_3e = uVar43;
    local_3c = uVar43;
    local_3a = uVar43;
    local_38 = uVar43;
    local_36 = uVar43;
    local_34 = uVar43;
    local_32 = uVar43;
    local_20c0 = local_2c0._0_16_;
    auStack_20b0 = local_2c0._16_16_;
    local_2228 = parasail_result_new_stats();
    if (local_2228 == (parasail_result_t *)0x0) {
      local_1fa0 = (parasail_result_t *)0x0;
    }
    else {
      local_2228->flag = local_2228->flag | 0x10210401;
      local_2010 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2018 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2020 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2028 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2030 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2038 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2040 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2048 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2050 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2058 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2060 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2068 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2070 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2078 = parasail_memalign___m256i(0x20,(long)(int)local_1fe8);
      local_2080 = parasail_memalign_int16_t(0x20,(long)(local_1fb4 + 1));
      if (local_2010 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2018 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2020 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2028 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2030 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2038 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2040 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2048 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2050 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2058 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2060 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2068 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2070 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2078 == (__m256i *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else if (local_2080 == (int16_t *)0x0) {
        local_1fa0 = (parasail_result_t *)0x0;
      }
      else {
        alVar5[1]._0_6_ = in_stack_ffffffffffffd7c0;
        alVar5[0] = in_stack_ffffffffffffd7b8;
        alVar5[1]._6_2_ = uVar45;
        alVar5[2]._0_2_ = uVar39;
        alVar5[2]._2_2_ = uVar40;
        alVar5[2]._4_2_ = uVar46;
        alVar5[2]._6_2_ = uVar47;
        alVar5[3]._0_2_ = uVar48;
        alVar5[3]._2_2_ = uVar41;
        alVar5[3]._4_2_ = uVar42;
        alVar5[3]._6_2_ = uVar43;
        parasail_memset___m256i(local_2820,alVar5,in_stack_ffffffffffffd7b0);
        alVar14[1]._0_6_ = in_stack_ffffffffffffd7c0;
        alVar14[0] = in_stack_ffffffffffffd7b8;
        alVar14[1]._6_2_ = uVar45;
        alVar14[2]._0_2_ = uVar39;
        alVar14[2]._2_2_ = uVar40;
        alVar14[2]._4_2_ = uVar46;
        alVar14[2]._6_2_ = uVar47;
        alVar14[3]._0_2_ = uVar48;
        alVar14[3]._2_2_ = uVar41;
        alVar14[3]._4_2_ = uVar42;
        alVar14[3]._6_2_ = uVar43;
        parasail_memset___m256i(local_2820,alVar14,in_stack_ffffffffffffd7b0);
        alVar15[1]._0_6_ = in_stack_ffffffffffffd7c0;
        alVar15[0] = in_stack_ffffffffffffd7b8;
        alVar15[1]._6_2_ = uVar45;
        alVar15[2]._0_2_ = uVar39;
        alVar15[2]._2_2_ = uVar40;
        alVar15[2]._4_2_ = uVar46;
        alVar15[2]._6_2_ = uVar47;
        alVar15[3]._0_2_ = uVar48;
        alVar15[3]._2_2_ = uVar41;
        alVar15[3]._4_2_ = uVar42;
        alVar15[3]._6_2_ = uVar43;
        parasail_memset___m256i(local_2820,alVar15,in_stack_ffffffffffffd7b0);
        alVar16[1]._0_6_ = in_stack_ffffffffffffd7c0;
        alVar16[0] = in_stack_ffffffffffffd7b8;
        alVar16[1]._6_2_ = uVar45;
        alVar16[2]._0_2_ = uVar39;
        alVar16[2]._2_2_ = uVar40;
        alVar16[2]._4_2_ = uVar46;
        alVar16[2]._6_2_ = uVar47;
        alVar16[3]._0_2_ = uVar48;
        alVar16[3]._2_2_ = uVar41;
        alVar16[3]._4_2_ = uVar42;
        alVar16[3]._6_2_ = uVar43;
        parasail_memset___m256i(local_2820,alVar16,in_stack_ffffffffffffd7b0);
        alVar17[1]._0_6_ = in_stack_ffffffffffffd7c0;
        alVar17[0] = in_stack_ffffffffffffd7b8;
        alVar17[1]._6_2_ = uVar45;
        alVar17[2]._0_2_ = uVar39;
        alVar17[2]._2_2_ = uVar40;
        alVar17[2]._4_2_ = uVar46;
        alVar17[2]._6_2_ = uVar47;
        alVar17[3]._0_2_ = uVar48;
        alVar17[3]._2_2_ = uVar41;
        alVar17[3]._4_2_ = uVar42;
        alVar17[3]._6_2_ = uVar43;
        parasail_memset___m256i(local_2820,alVar17,in_stack_ffffffffffffd7b0);
        c[1]._0_6_ = in_stack_ffffffffffffd7c0;
        c[0] = in_stack_ffffffffffffd7b8;
        c[1]._6_2_ = uVar45;
        c[2]._0_2_ = uVar39;
        c[2]._2_2_ = uVar40;
        c[2]._4_2_ = uVar46;
        c[2]._6_2_ = uVar47;
        c[3]._0_2_ = uVar48;
        c[3]._2_2_ = uVar41;
        c[3]._4_2_ = uVar42;
        c[3]._6_2_ = uVar43;
        parasail_memset___m256i(local_2820,c,in_stack_ffffffffffffd7b0);
        c_00[1]._0_6_ = in_stack_ffffffffffffd7c0;
        c_00[0] = in_stack_ffffffffffffd7b8;
        c_00[1]._6_2_ = uVar45;
        c_00[2]._0_2_ = uVar39;
        c_00[2]._2_2_ = uVar40;
        c_00[2]._4_2_ = uVar46;
        c_00[2]._6_2_ = uVar47;
        c_00[3]._0_2_ = uVar48;
        c_00[3]._2_2_ = uVar41;
        c_00[3]._4_2_ = uVar42;
        c_00[3]._6_2_ = uVar43;
        parasail_memset___m256i(local_2820,c_00,in_stack_ffffffffffffd7b0);
        local_1a00 = local_2100;
        uStack_19f8 = uStack_20f8;
        uStack_19f0 = uStack_20f0;
        uStack_19e8 = uStack_20e8;
        local_1a20 = local_20a0;
        uStack_1a18 = uStack_2098;
        uStack_1a10 = uStack_2090;
        uStack_1a08 = uStack_2088;
        auVar8._8_8_ = uStack_20f8;
        auVar8._0_8_ = local_2100;
        auVar8._16_8_ = uStack_20f0;
        auVar8._24_8_ = uStack_20e8;
        auVar7._8_8_ = uStack_2098;
        auVar7._0_8_ = local_20a0;
        auVar7._16_8_ = uStack_2090;
        auVar7._24_8_ = uStack_2088;
        local_2260 = vpsubsw_avx2(auVar8,auVar7);
        local_2280._8_8_ = uStack_2118;
        local_2280._0_8_ = local_2120;
        local_2280._16_8_ = uStack_2110;
        local_2280._24_8_ = uStack_2108;
        local_1fc0 = local_1fe8;
        while (local_1fc0 = local_1fc0 - 1, -1 < (int)local_1fc0) {
          local_1640 = local_2070 + (int)local_1fc0;
          local_1660 = local_2260._0_8_;
          lStack_1658 = local_2260._8_8_;
          lStack_1650 = local_2260._16_8_;
          lStack_1648 = local_2260._24_8_;
          (*local_1640)[0] = local_2260._0_8_;
          (*local_1640)[1] = local_2260._8_8_;
          (*local_1640)[2] = local_2260._16_8_;
          (*local_1640)[3] = local_2260._24_8_;
          local_1668 = local_2078 + (int)local_1fc0;
          local_16a0 = local_2280._0_8_;
          lStack_1698 = local_2280._8_8_;
          lStack_1690 = local_2280._16_8_;
          lStack_1688 = local_2280._24_8_;
          (*local_1668)[0] = local_2280._0_8_;
          (*local_1668)[1] = local_2280._8_8_;
          (*local_1668)[2] = local_2280._16_8_;
          (*local_1668)[3] = local_2280._24_8_;
          local_1a40 = local_2260._0_8_;
          lStack_1a38 = local_2260._8_8_;
          lStack_1a30 = local_2260._16_8_;
          lStack_1a28 = local_2260._24_8_;
          uStack_1a50 = auStack_20b0._0_8_;
          uStack_1a48 = auStack_20b0._8_8_;
          auVar9._16_8_ = auStack_20b0._0_8_;
          auVar9._0_16_ = local_20c0;
          auVar9._24_8_ = auStack_20b0._8_8_;
          local_2260 = vpsubsw_avx2(local_2260,auVar9);
          local_1c00 = local_2280._0_8_;
          lStack_1bf8 = local_2280._8_8_;
          lStack_1bf0 = local_2280._16_8_;
          lStack_1be8 = local_2280._24_8_;
          local_1c20 = local_2120;
          uStack_1c18 = uStack_2118;
          uStack_1c10 = uStack_2110;
          uStack_1c08 = uStack_2108;
          auVar7._8_8_ = uStack_2118;
          auVar7._0_8_ = local_2120;
          auVar7._16_8_ = uStack_2110;
          auVar7._24_8_ = uStack_2108;
          local_2280 = vpaddsw_avx2(local_2280,auVar7);
          local_1a60 = local_20c0;
        }
        local_2284 = 0;
        local_1fc0 = 0;
        while( true ) {
          if ((int)local_1fe8 <= (int)local_1fc0) break;
          for (local_2288 = 0; local_2288 < local_1fe4; local_2288 = local_2288 + 1) {
            iVar44 = -(local_1fbc * (local_2288 * local_1fe8 + local_1fc0)) - local_1fb8;
            if (iVar44 < -0x8000) {
              iVar44 = -0x8000;
            }
            *(short *)((long)&local_22c0 + (long)local_2288 * 2) = (short)iVar44;
          }
          local_16a8 = local_2030 + local_2284;
          (*local_16a8)[0] = local_22c0;
          (*local_16a8)[1] = lStack_22b8;
          (*local_16a8)[2] = lStack_22b0;
          (*local_16a8)[3] = lStack_22a8;
          local_2284 = local_2284 + 1;
          local_1fc0 = local_1fc0 + 1;
        }
        *local_2080 = 0;
        for (local_1fc0 = 1; (int)local_1fc0 <= local_1fb4; local_1fc0 = local_1fc0 + 1) {
          iVar44 = -(local_1fbc * (local_1fc0 + -1)) - local_1fb8;
          if (iVar44 < -0x8000) {
            iVar44 = -0x8000;
          }
          local_2080[(int)local_1fc0] = (int16_t)iVar44;
        }
        for (local_1fc4 = 0; local_1fc4 < local_1fb4; local_1fc4 = local_1fc4 + 1) {
          local_1548 = local_2030 + (int)(local_1fe8 - 1);
          local_1550 = local_2038 + (int)(local_1fe8 - 1);
          local_1558 = local_2040 + (int)(local_1fe8 - 1);
          local_1560 = local_2048 + (int)(local_1fe8 - 1);
          auVar13 = vperm2i128_avx2(auVar7,(undefined1  [32])*local_1548,0x28);
          auVar12 = vpalignr_avx2((undefined1  [32])*local_1548,auVar13,0xe);
          auVar13 = vperm2i128_avx2(auVar13,(undefined1  [32])*local_1550,0x28);
          local_25a0 = (__m256i)vpalignr_avx2((undefined1  [32])*local_1550,auVar13,0xe);
          auVar13 = vperm2i128_avx2(auVar13,(undefined1  [32])*local_1558,0x28);
          local_25c0 = (__m256i)vpalignr_avx2((undefined1  [32])*local_1558,auVar13,0xe);
          auVar13 = vperm2i128_avx2(auVar13,(undefined1  [32])*local_1560,0x28);
          local_25e0 = (__m256i)vpalignr_avx2((undefined1  [32])*local_1560,auVar13,0xe);
          auVar3 = vpinsrw_avx(auVar12._0_16_,(uint)(ushort)local_2080[local_1fc4],0);
          local_2580 = (__m256i)vblendps_avx(auVar12,ZEXT1632(auVar3),0xf);
          iVar44 = *(int *)(*(long *)(local_1fe0 + 0x10) +
                           (ulong)*(byte *)(local_1fb0 + local_1fc4) * 4);
          iVar1 = *(int *)(*(long *)(local_1fe0 + 0x10) +
                          (ulong)*(byte *)(local_1fb0 + local_1fc4) * 4);
          iVar2 = *(int *)(*(long *)(local_1fe0 + 0x10) +
                          (ulong)*(byte *)(local_1fb0 + local_1fc4) * 4);
          local_1a80 = local_2160;
          uStack_1a78 = uStack_2158;
          uStack_1a70 = uStack_2150;
          uStack_1a68 = uStack_2148;
          local_1aa0 = (*local_2070)[0];
          lStack_1a98 = (*local_2070)[1];
          lStack_1a90 = (*local_2070)[2];
          lStack_1a88 = (*local_2070)[3];
          alVar5 = *local_2070;
          auVar10._8_8_ = uStack_2158;
          auVar10._0_8_ = local_2160;
          auVar10._16_8_ = uStack_2150;
          auVar10._24_8_ = uStack_2148;
          _local_23c0 = vpsubsw_avx2(auVar10,(undefined1  [32])alVar5);
          local_2440._8_8_ = uStack_2158;
          local_2440._0_8_ = local_2160;
          local_2440._16_8_ = uStack_2150;
          local_2440._24_8_ = uStack_2148;
          local_24a0._8_8_ = uStack_20f8;
          local_24a0._0_8_ = local_2100;
          local_24a0._16_8_ = uStack_20f0;
          local_24a0._24_8_ = uStack_20e8;
          local_24c0._8_8_ = uStack_20f8;
          local_24c0._0_8_ = local_2100;
          local_24c0._16_8_ = uStack_20f0;
          local_24c0._24_8_ = uStack_20e8;
          local_24e0._8_8_ = uStack_20f8;
          local_24e0._0_8_ = local_2100;
          local_24e0._16_8_ = uStack_20f0;
          local_24e0._24_8_ = uStack_20e8;
          local_1fc0 = 0;
          while( true ) {
            if ((int)local_1fe8 <= (int)local_1fc0) break;
            local_1568 = local_2030 + (int)local_1fc0;
            auVar30 = *(undefined1 (*) [24])*local_1568;
            lStack_1aa8 = (*local_1568)[3];
            alVar14 = *local_1568;
            local_1570 = local_2038 + (int)local_1fc0;
            auVar31 = *(undefined1 (*) [24])*local_1570;
            lStack_5c8 = (*local_1570)[3];
            alVar15 = *local_1570;
            local_1578 = local_2040 + (int)local_1fc0;
            auVar32 = *(undefined1 (*) [24])*local_1578;
            lStack_628 = (*local_1578)[3];
            alVar16 = *local_1578;
            local_1580 = local_2048 + (int)local_1fc0;
            auVar33 = *(undefined1 (*) [24])*local_1580;
            lStack_688 = (*local_1580)[3];
            alVar17 = *local_1580;
            local_1588 = local_2010 + (int)local_1fc0;
            auVar34 = *(undefined1 (*) [24])*local_1588;
            lStack_1ae8 = (*local_1588)[3];
            local_1590 = local_2018 + (int)local_1fc0;
            auVar35 = *(undefined1 (*) [24])*local_1590;
            lStack_5a8 = (*local_1590)[3];
            local_1598 = local_2020 + (int)local_1fc0;
            auVar36 = *(undefined1 (*) [24])*local_1598;
            lStack_608 = (*local_1598)[3];
            local_15a0 = local_2028 + (int)local_1fc0;
            auVar37 = *(undefined1 (*) [24])*local_15a0;
            lStack_668 = (*local_15a0)[3];
            local_15a8 = (undefined1 (*) [32])
                         (local_1ff8 + (long)(int)(iVar44 * local_1fe8) * 0x20 +
                         (long)(int)local_1fc0 * 0x20);
            local_1d20 = *(undefined8 *)*local_15a8;
            uStack_1d18 = *(undefined8 *)(*local_15a8 + 8);
            uStack_1d10 = *(undefined8 *)(*local_15a8 + 0x10);
            uStack_1d08 = *(undefined8 *)(*local_15a8 + 0x18);
            local_15b0 = (undefined1 (*) [32])
                         (local_2000 + (long)(int)(iVar1 * local_1fe8) * 0x20 +
                         (long)(int)local_1fc0 * 0x20);
            local_1d60 = *(undefined8 *)*local_15b0;
            uStack_1d58 = *(undefined8 *)(*local_15b0 + 8);
            uStack_1d50 = *(undefined8 *)(*local_15b0 + 0x10);
            uStack_1d48 = *(undefined8 *)(*local_15b0 + 0x18);
            local_15b8 = (undefined1 (*) [32])
                         (local_2008 + (long)(int)(iVar2 * local_1fe8) * 0x20 +
                         (long)(int)local_1fc0 * 0x20);
            local_1da0 = *(undefined8 *)*local_15b8;
            uStack_1d98 = *(undefined8 *)(*local_15b8 + 8);
            uStack_1d90 = *(undefined8 *)(*local_15b8 + 0x10);
            uStack_1d88 = *(undefined8 *)(*local_15b8 + 0x18);
            local_15c0 = local_2070 + (int)local_1fc0;
            auVar38 = *(undefined1 (*) [24])*local_15c0;
            lStack_1c88 = (*local_15c0)[3];
            local_15c8 = local_2078 + (int)local_1fc0;
            local_1ce0 = (*local_15c8)[0];
            lStack_1cd8 = (*local_15c8)[1];
            lStack_1cd0 = (*local_15c8)[2];
            lStack_1cc8 = (*local_15c8)[3];
            local_2500._0_8_ = auVar30._0_8_;
            local_1ac0 = local_2500._0_8_;
            local_2500._8_8_ = auVar30._8_8_;
            uStack_1ab8 = local_2500._8_8_;
            local_2500._16_8_ = auVar30._16_8_;
            uStack_1ab0 = local_2500._16_8_;
            local_1ae0 = local_20a0;
            uStack_1ad8 = uStack_2098;
            uStack_1ad0 = uStack_2090;
            uStack_1ac8 = uStack_2088;
            auVar25._8_8_ = uStack_2098;
            auVar25._0_8_ = local_20a0;
            auVar25._16_8_ = uStack_2090;
            auVar25._24_8_ = uStack_2088;
            auVar13 = vpsubsw_avx2((undefined1  [32])*local_1568,auVar25);
            local_2300 = auVar34._0_8_;
            local_1b00 = local_2300;
            lStack_22f8 = auVar34._8_8_;
            uStack_1af8 = lStack_22f8;
            lStack_22f0 = auVar34._16_8_;
            uStack_1af0 = lStack_22f0;
            uStack_1b10 = auStack_20b0._0_8_;
            uStack_1b08 = auStack_20b0._8_8_;
            auVar24._16_8_ = auStack_20b0._0_8_;
            auVar24._0_16_ = local_20c0;
            auVar24._24_8_ = auStack_20b0._8_8_;
            auVar11 = vpsubsw_avx2((undefined1  [32])*local_1588,auVar24);
            local_2340 = auVar13._0_8_;
            local_1320 = local_2340;
            uStack_2338 = auVar13._8_8_;
            uStack_1318 = uStack_2338;
            uStack_2330 = auVar13._16_8_;
            uStack_1310 = uStack_2330;
            uStack_2328 = auVar13._24_8_;
            uStack_1308 = uStack_2328;
            local_2320 = auVar11._0_8_;
            local_1340 = local_2320;
            uStack_2318 = auVar11._8_8_;
            uStack_1338 = uStack_2318;
            uStack_2310 = auVar11._16_8_;
            uStack_1330 = uStack_2310;
            uStack_2308 = auVar11._24_8_;
            uStack_1328 = uStack_2308;
            auVar12 = vpcmpgtw_avx2(auVar13,auVar11);
            local_fe0 = local_2340;
            uStack_fd8 = uStack_2338;
            uStack_fd0 = uStack_2330;
            uStack_fc8 = uStack_2328;
            local_1000 = local_2320;
            uStack_ff8 = uStack_2318;
            uStack_ff0 = uStack_2310;
            uStack_fe8 = uStack_2308;
            auVar10 = vpmaxsw_avx2(auVar13,auVar11);
            local_2360 = auVar35._0_8_;
            local_5c0 = local_2360;
            lStack_2358 = auVar35._8_8_;
            uStack_5b8 = lStack_2358;
            lStack_2350 = auVar35._16_8_;
            uStack_5b0 = lStack_2350;
            local_2520._0_8_ = auVar31._0_8_;
            local_5e0 = local_2520._0_8_;
            local_2520._8_8_ = auVar31._8_8_;
            uStack_5d8 = local_2520._8_8_;
            local_2520._16_8_ = auVar31._16_8_;
            uStack_5d0 = local_2520._16_8_;
            local_26c0 = auVar12._0_8_;
            local_600 = local_26c0;
            uStack_26b8 = auVar12._8_8_;
            uStack_5f8 = uStack_26b8;
            uStack_26b0 = auVar12._16_8_;
            uStack_5f0 = uStack_26b0;
            uStack_26a8 = auVar12._24_8_;
            uStack_5e8 = uStack_26a8;
            auVar7 = vpblendvb_avx2((undefined1  [32])*local_1590,(undefined1  [32])*local_1570,
                                    auVar12);
            local_2380 = auVar36._0_8_;
            local_620 = local_2380;
            lStack_2378 = auVar36._8_8_;
            uStack_618 = lStack_2378;
            lStack_2370 = auVar36._16_8_;
            uStack_610 = lStack_2370;
            local_2540._0_8_ = auVar32._0_8_;
            local_640 = local_2540._0_8_;
            local_2540._8_8_ = auVar32._8_8_;
            uStack_638 = local_2540._8_8_;
            local_2540._16_8_ = auVar32._16_8_;
            uStack_630 = local_2540._16_8_;
            local_660 = local_26c0;
            uStack_658 = uStack_26b8;
            uStack_650 = uStack_26b0;
            uStack_648 = uStack_26a8;
            auVar8 = vpblendvb_avx2((undefined1  [32])*local_1598,(undefined1  [32])*local_1578,
                                    auVar12);
            local_23a0 = auVar37._0_8_;
            local_680 = local_23a0;
            lStack_2398 = auVar37._8_8_;
            uStack_678 = lStack_2398;
            lStack_2390 = auVar37._16_8_;
            uStack_670 = lStack_2390;
            local_2560._0_8_ = auVar33._0_8_;
            local_6a0 = local_2560._0_8_;
            local_2560._8_8_ = auVar33._8_8_;
            uStack_698 = local_2560._8_8_;
            local_2560._16_8_ = auVar33._16_8_;
            uStack_690 = local_2560._16_8_;
            local_6c0 = local_26c0;
            uStack_6b8 = uStack_26b8;
            uStack_6b0 = uStack_26b0;
            uStack_6a8 = uStack_26a8;
            auVar12 = vpblendvb_avx2((undefined1  [32])*local_15a0,(undefined1  [32])*local_1580,
                                     auVar12);
            local_23a0 = auVar12._0_8_;
            local_1c40 = local_23a0;
            lStack_2398 = auVar12._8_8_;
            uStack_1c38 = lStack_2398;
            lStack_2390 = auVar12._16_8_;
            uStack_1c30 = lStack_2390;
            lStack_2388 = auVar12._24_8_;
            uStack_1c28 = lStack_2388;
            local_1c60 = local_2120;
            uStack_1c58 = uStack_2118;
            uStack_1c50 = uStack_2110;
            uStack_1c48 = uStack_2108;
            auVar21._8_8_ = uStack_2118;
            auVar21._0_8_ = local_2120;
            auVar21._16_8_ = uStack_2110;
            auVar21._24_8_ = uStack_2108;
            alVar5 = (__m256i)vpaddsw_avx2(auVar12,auVar21);
            local_1c80 = local_23c0;
            uStack_1c78 = uStack_23b8;
            uStack_1c70 = uStack_23b0;
            uStack_1c68 = uStack_23a8;
            local_2700 = auVar38._0_8_;
            local_1ca0 = local_2700;
            uStack_26f8 = auVar38._8_8_;
            uStack_1c98 = uStack_26f8;
            uStack_26f0 = auVar38._16_8_;
            uStack_1c90 = uStack_26f0;
            auVar12 = vpaddsw_avx2(_local_23c0,(undefined1  [32])*local_15c0);
            local_1360 = local_2440._0_8_;
            uStack_1358 = local_2440._8_8_;
            uStack_1350 = local_2440._16_8_;
            uStack_1348 = local_2440._24_8_;
            local_2700 = auVar12._0_8_;
            local_1380 = local_2700;
            uStack_26f8 = auVar12._8_8_;
            uStack_1378 = uStack_26f8;
            uStack_26f0 = auVar12._16_8_;
            uStack_1370 = uStack_26f0;
            uStack_26e8 = auVar12._24_8_;
            uStack_1368 = uStack_26e8;
            local_4c0 = vpcmpgtw_avx2(local_2440,auVar12);
            local_380 = local_2440._0_8_;
            uStack_378 = local_2440._8_8_;
            uStack_370 = local_2440._16_8_;
            uStack_368 = local_2440._24_8_;
            local_3a0 = local_2700;
            uStack_398 = uStack_26f8;
            uStack_390 = uStack_26f0;
            uStack_388 = uStack_26e8;
            local_4e0 = vpcmpeqw_avx2(local_2440,auVar12);
            auVar13 = vpor_avx2(local_4c0,local_4e0);
            local_1020 = local_2440._0_8_;
            uStack_1018 = local_2440._8_8_;
            uStack_1010 = local_2440._16_8_;
            uStack_1008 = local_2440._24_8_;
            local_1040 = local_2700;
            uStack_1038 = uStack_26f8;
            uStack_1030 = uStack_26f0;
            uStack_1028 = uStack_26e8;
            local_2440 = vpmaxsw_avx2(local_2440,auVar12);
            local_6e0 = local_23e0._0_8_;
            uStack_6d8 = local_23e0._8_8_;
            uStack_6d0 = local_23e0._16_8_;
            uStack_6c8 = local_23e0._24_8_;
            local_700 = local_24a0._0_8_;
            uStack_6f8 = local_24a0._8_8_;
            uStack_6f0 = local_24a0._16_8_;
            uStack_6e8 = local_24a0._24_8_;
            local_26c0 = auVar13._0_8_;
            local_720 = local_26c0;
            uStack_26b8 = auVar13._8_8_;
            uStack_718 = uStack_26b8;
            uStack_26b0 = auVar13._16_8_;
            uStack_710 = uStack_26b0;
            uStack_26a8 = auVar13._24_8_;
            uStack_708 = uStack_26a8;
            local_24a0 = vpblendvb_avx2(local_23e0,local_24a0,auVar13);
            local_740 = local_2400._0_8_;
            uStack_738 = local_2400._8_8_;
            uStack_730 = local_2400._16_8_;
            uStack_728 = local_2400._24_8_;
            local_760 = local_24c0._0_8_;
            uStack_758 = local_24c0._8_8_;
            uStack_750 = local_24c0._16_8_;
            uStack_748 = local_24c0._24_8_;
            local_780 = local_26c0;
            uStack_778 = uStack_26b8;
            uStack_770 = uStack_26b0;
            uStack_768 = uStack_26a8;
            local_24c0 = vpblendvb_avx2(local_2400,local_24c0,auVar13);
            local_1cc0 = local_2420._0_8_;
            uStack_1cb8 = local_2420._8_8_;
            uStack_1cb0 = local_2420._16_8_;
            uStack_1ca8 = local_2420._24_8_;
            local_7a0 = vpaddsw_avx2(local_2420,(undefined1  [32])*local_15c8);
            local_7c0 = local_24e0._0_8_;
            uStack_7b8 = local_24e0._8_8_;
            uStack_7b0 = local_24e0._16_8_;
            uStack_7a8 = local_24e0._24_8_;
            local_7e0 = local_26c0;
            uStack_7d8 = uStack_26b8;
            uStack_7d0 = uStack_26b0;
            uStack_7c8 = uStack_26a8;
            local_24e0 = vpblendvb_avx2(local_7a0,local_24e0,auVar13);
            local_1d00 = local_2580[0];
            lStack_1cf8 = local_2580[1];
            lStack_1cf0 = local_2580[2];
            lStack_1ce8 = local_2580[3];
            auVar12 = vpaddsw_avx2((undefined1  [32])local_2580,*local_15a8);
            local_1d40 = local_25a0[0];
            lStack_1d38 = local_25a0[1];
            lStack_1d30 = local_25a0[2];
            lStack_1d28 = local_25a0[3];
            auVar13 = vpaddsw_avx2((undefined1  [32])local_25a0,*local_15b0);
            local_1d80 = local_25c0[0];
            lStack_1d78 = local_25c0[1];
            lStack_1d70 = local_25c0[2];
            lStack_1d68 = local_25c0[3];
            auVar11 = vpaddsw_avx2((undefined1  [32])local_25c0,*local_15b8);
            local_1dc0 = local_25e0[0];
            lStack_1db8 = local_25e0[1];
            lStack_1db0 = local_25e0[2];
            lStack_1da8 = local_25e0[3];
            local_1de0 = local_2120;
            uStack_1dd8 = uStack_2118;
            uStack_1dd0 = uStack_2110;
            uStack_1dc8 = uStack_2108;
            auVar20._8_8_ = uStack_2118;
            auVar20._0_8_ = local_2120;
            auVar20._16_8_ = uStack_2110;
            auVar20._24_8_ = uStack_2108;
            auVar6 = vpaddsw_avx2((undefined1  [32])local_25e0,auVar20);
            local_2300 = auVar10._0_8_;
            local_13a0 = local_2300;
            lStack_22f8 = auVar10._8_8_;
            lStack_1398 = lStack_22f8;
            lStack_22f0 = auVar10._16_8_;
            lStack_1390 = lStack_22f0;
            lStack_22e8 = auVar10._24_8_;
            lStack_1388 = lStack_22e8;
            local_2580[0] = auVar12._0_8_;
            local_13c0 = local_2580[0];
            local_2580[1] = auVar12._8_8_;
            lStack_13b8 = local_2580[1];
            local_2580[2] = auVar12._16_8_;
            lStack_13b0 = local_2580[2];
            local_2580[3] = auVar12._24_8_;
            lStack_13a8 = local_2580[3];
            auVar9 = vpcmpgtw_avx2(auVar10,auVar12);
            local_1060 = local_2300;
            lStack_1058 = lStack_22f8;
            lStack_1050 = lStack_22f0;
            lStack_1048 = lStack_22e8;
            local_1080 = local_2580[0];
            lStack_1078 = local_2580[1];
            lStack_1070 = local_2580[2];
            lStack_1068 = local_2580[3];
            _local_23c0 = vpmaxsw_avx2(auVar10,auVar12);
            local_25a0[0] = auVar13._0_8_;
            local_800 = local_25a0[0];
            local_25a0[1] = auVar13._8_8_;
            lStack_7f8 = local_25a0[1];
            local_25a0[2] = auVar13._16_8_;
            lStack_7f0 = local_25a0[2];
            local_25a0[3] = auVar13._24_8_;
            lStack_7e8 = local_25a0[3];
            local_2360 = auVar7._0_8_;
            local_820 = local_2360;
            lStack_2358 = auVar7._8_8_;
            lStack_818 = lStack_2358;
            lStack_2350 = auVar7._16_8_;
            lStack_810 = lStack_2350;
            lStack_2348 = auVar7._24_8_;
            lStack_808 = lStack_2348;
            local_26c0 = auVar9._0_8_;
            local_840 = local_26c0;
            uStack_26b8 = auVar9._8_8_;
            uStack_838 = uStack_26b8;
            uStack_26b0 = auVar9._16_8_;
            uStack_830 = uStack_26b0;
            uStack_26a8 = auVar9._24_8_;
            uStack_828 = uStack_26a8;
            local_23e0 = vpblendvb_avx2(auVar13,auVar7,auVar9);
            local_25c0[0] = auVar11._0_8_;
            local_860 = local_25c0[0];
            local_25c0[1] = auVar11._8_8_;
            lStack_858 = local_25c0[1];
            local_25c0[2] = auVar11._16_8_;
            lStack_850 = local_25c0[2];
            local_25c0[3] = auVar11._24_8_;
            lStack_848 = local_25c0[3];
            local_2380 = auVar8._0_8_;
            local_880 = local_2380;
            lStack_2378 = auVar8._8_8_;
            lStack_878 = lStack_2378;
            lStack_2370 = auVar8._16_8_;
            lStack_870 = lStack_2370;
            lStack_2368 = auVar8._24_8_;
            lStack_868 = lStack_2368;
            local_8a0 = local_26c0;
            uStack_898 = uStack_26b8;
            uStack_890 = uStack_26b0;
            uStack_888 = uStack_26a8;
            local_2400 = vpblendvb_avx2(auVar11,auVar8,auVar9);
            local_25e0[0] = auVar6._0_8_;
            local_8c0 = local_25e0[0];
            local_25e0[1] = auVar6._8_8_;
            lStack_8b8 = local_25e0[1];
            local_25e0[2] = auVar6._16_8_;
            lStack_8b0 = local_25e0[2];
            local_25e0[3] = auVar6._24_8_;
            lStack_8a8 = local_25e0[3];
            local_23a0 = alVar5[0];
            local_8e0 = local_23a0;
            lStack_2398 = alVar5[1];
            lStack_8d8 = lStack_2398;
            lStack_2390 = alVar5[2];
            lStack_8d0 = lStack_2390;
            lStack_2388 = alVar5[3];
            lStack_8c8 = lStack_2388;
            local_900 = local_26c0;
            uStack_8f8 = uStack_26b8;
            uStack_8f0 = uStack_26b0;
            uStack_8e8 = uStack_26a8;
            local_2420 = vpblendvb_avx2(auVar6,(undefined1  [32])alVar5,auVar9);
            local_16e8 = local_2010 + (int)local_1fc0;
            local_1720 = local_2300;
            lStack_1718 = lStack_22f8;
            lStack_1710 = lStack_22f0;
            lStack_1708 = lStack_22e8;
            (*local_16e8)[0] = local_2300;
            (*local_16e8)[1] = lStack_22f8;
            (*local_16e8)[2] = lStack_22f0;
            (*local_16e8)[3] = lStack_22e8;
            local_1728 = local_2018 + (int)local_1fc0;
            local_1760 = local_2360;
            lStack_1758 = lStack_2358;
            lStack_1750 = lStack_2350;
            lStack_1748 = lStack_2348;
            (*local_1728)[0] = local_2360;
            (*local_1728)[1] = lStack_2358;
            (*local_1728)[2] = lStack_2350;
            (*local_1728)[3] = lStack_2348;
            local_1768 = local_2020 + (int)local_1fc0;
            local_17a0 = local_2380;
            lStack_1798 = lStack_2378;
            lStack_1790 = lStack_2370;
            lStack_1788 = lStack_2368;
            (*local_1768)[0] = local_2380;
            (*local_1768)[1] = lStack_2378;
            (*local_1768)[2] = lStack_2370;
            (*local_1768)[3] = lStack_2368;
            local_17a8 = local_2028 + (int)local_1fc0;
            local_17e0 = local_23a0;
            lStack_17d8 = lStack_2398;
            lStack_17d0 = lStack_2390;
            lStack_17c8 = lStack_2388;
            (*local_17a8)[0] = local_23a0;
            (*local_17a8)[1] = lStack_2398;
            (*local_17a8)[2] = lStack_2390;
            (*local_17a8)[3] = lStack_2388;
            local_17e8 = local_2030 + (int)local_1fc0;
            local_1820 = local_2580[0];
            lStack_1818 = local_2580[1];
            lStack_1810 = local_2580[2];
            lStack_1808 = local_2580[3];
            (*local_17e8)[0] = local_2580[0];
            (*local_17e8)[1] = local_2580[1];
            (*local_17e8)[2] = local_2580[2];
            (*local_17e8)[3] = local_2580[3];
            local_1828 = local_2038 + (int)local_1fc0;
            local_1860 = local_25a0[0];
            lStack_1858 = local_25a0[1];
            lStack_1850 = local_25a0[2];
            lStack_1848 = local_25a0[3];
            (*local_1828)[0] = local_25a0[0];
            (*local_1828)[1] = local_25a0[1];
            (*local_1828)[2] = local_25a0[2];
            (*local_1828)[3] = local_25a0[3];
            local_1868 = local_2040 + (int)local_1fc0;
            local_18a0 = local_25c0[0];
            lStack_1898 = local_25c0[1];
            lStack_1890 = local_25c0[2];
            lStack_1888 = local_25c0[3];
            (*local_1868)[0] = local_25c0[0];
            (*local_1868)[1] = local_25c0[1];
            (*local_1868)[2] = local_25c0[2];
            (*local_1868)[3] = local_25c0[3];
            local_18a8 = local_2048 + (int)local_1fc0;
            local_18e0 = local_25e0[0];
            lStack_18d8 = local_25e0[1];
            lStack_18d0 = local_25e0[2];
            lStack_18c8 = local_25e0[3];
            (*local_18a8)[0] = local_25e0[0];
            (*local_18a8)[1] = local_25e0[1];
            (*local_18a8)[2] = local_25e0[2];
            (*local_18a8)[3] = local_25e0[3];
            local_1fc0 = local_1fc0 + 1;
            local_25e0 = alVar17;
            local_25c0 = alVar16;
            local_25a0 = alVar15;
            local_2580 = alVar14;
            local_1b20 = local_20c0;
          }
          auVar13 = vperm2i128_avx2((undefined1  [32])alVar5,_local_23c0,0x28);
          auVar12 = vpalignr_avx2(_local_23c0,auVar13,0xe);
          auVar13 = vperm2i128_avx2(auVar13,local_23e0,0x28);
          local_23e0 = vpalignr_avx2(local_23e0,auVar13,0xe);
          auVar13 = vperm2i128_avx2(auVar13,local_2400,0x28);
          local_2400 = vpalignr_avx2(local_2400,auVar13,0xe);
          auVar13 = vperm2i128_avx2(auVar13,local_2420,0x28);
          local_2420 = vpalignr_avx2(local_2420,auVar13,0xe);
          stack0xffffffffffffdc42 = auVar12._2_30_;
          local_23c0._0_2_ = local_2080[(long)local_1fc4 + 1];
          local_15d0 = local_2070;
          auVar30 = *(undefined1 (*) [24])*local_2070;
          lStack_1e08 = (*local_2070)[3];
          local_15d8 = local_2078;
          local_1e60 = (*local_2078)[0];
          lStack_1e58 = (*local_2078)[1];
          lStack_1e50 = (*local_2078)[2];
          lStack_1e48 = (*local_2078)[3];
          local_1e00 = local_23c0;
          uStack_23b8 = auVar12._8_8_;
          uStack_1df8 = uStack_23b8;
          uStack_23b0 = auVar12._16_8_;
          uStack_1df0 = uStack_23b0;
          uStack_23a8 = auVar12._24_8_;
          uStack_1de8 = uStack_23a8;
          local_2700 = auVar30._0_8_;
          local_1e20 = local_2700;
          uStack_26f8 = auVar30._8_8_;
          uStack_1e18 = uStack_26f8;
          uStack_26f0 = auVar30._16_8_;
          uStack_1e10 = uStack_26f0;
          auVar19._8_8_ = uStack_23b8;
          auVar19._0_8_ = local_23c0;
          auVar19._16_8_ = uStack_23b0;
          auVar19._24_8_ = uStack_23a8;
          auVar12 = vpaddsw_avx2(auVar19,(undefined1  [32])*local_2070);
          local_2700 = auVar12._0_8_;
          local_13e0 = local_2700;
          uStack_26f8 = auVar12._8_8_;
          uStack_13d8 = uStack_26f8;
          uStack_26f0 = auVar12._16_8_;
          uStack_13d0 = uStack_26f0;
          uStack_26e8 = auVar12._24_8_;
          uStack_13c8 = uStack_26e8;
          local_1400 = local_2440._0_8_;
          uStack_13f8 = local_2440._8_8_;
          uStack_13f0 = local_2440._16_8_;
          uStack_13e8 = local_2440._24_8_;
          local_500 = vpcmpgtw_avx2(auVar12,local_2440);
          local_3c0 = local_2700;
          uStack_3b8 = uStack_26f8;
          uStack_3b0 = uStack_26f0;
          uStack_3a8 = uStack_26e8;
          local_3e0 = local_2440._0_8_;
          uStack_3d8 = local_2440._8_8_;
          uStack_3d0 = local_2440._16_8_;
          uStack_3c8 = local_2440._24_8_;
          local_520 = vpcmpeqw_avx2(auVar12,local_2440);
          auVar13 = vpor_avx2(local_500,local_520);
          local_10a0 = local_2440._0_8_;
          uStack_1098 = local_2440._8_8_;
          uStack_1090 = local_2440._16_8_;
          uStack_1088 = local_2440._24_8_;
          local_10c0 = local_2700;
          uStack_10b8 = uStack_26f8;
          uStack_10b0 = uStack_26f0;
          uStack_10a8 = uStack_26e8;
          local_2440 = vpmaxsw_avx2(local_2440,auVar12);
          local_920 = local_24a0._0_8_;
          uStack_918 = local_24a0._8_8_;
          uStack_910 = local_24a0._16_8_;
          uStack_908 = local_24a0._24_8_;
          local_940 = local_23e0._0_8_;
          uStack_938 = local_23e0._8_8_;
          uStack_930 = local_23e0._16_8_;
          uStack_928 = local_23e0._24_8_;
          local_26c0 = auVar13._0_8_;
          local_960 = local_26c0;
          uStack_26b8 = auVar13._8_8_;
          uStack_958 = uStack_26b8;
          uStack_26b0 = auVar13._16_8_;
          uStack_950 = uStack_26b0;
          uStack_26a8 = auVar13._24_8_;
          uStack_948 = uStack_26a8;
          local_24a0 = vpblendvb_avx2(local_24a0,local_23e0,auVar13);
          local_980 = local_24c0._0_8_;
          uStack_978 = local_24c0._8_8_;
          uStack_970 = local_24c0._16_8_;
          uStack_968 = local_24c0._24_8_;
          local_9a0 = local_2400._0_8_;
          uStack_998 = local_2400._8_8_;
          uStack_990 = local_2400._16_8_;
          uStack_988 = local_2400._24_8_;
          local_9c0 = local_26c0;
          uStack_9b8 = uStack_26b8;
          uStack_9b0 = uStack_26b0;
          uStack_9a8 = uStack_26a8;
          local_24c0 = vpblendvb_avx2(local_24c0,local_2400,auVar13);
          local_9e0 = local_24e0._0_8_;
          uStack_9d8 = local_24e0._8_8_;
          uStack_9d0 = local_24e0._16_8_;
          uStack_9c8 = local_24e0._24_8_;
          local_1e40 = local_2420._0_8_;
          uStack_1e38 = local_2420._8_8_;
          uStack_1e30 = local_2420._16_8_;
          uStack_1e28 = local_2420._24_8_;
          local_a00 = vpaddsw_avx2(local_2420,(undefined1  [32])*local_2078);
          local_a20 = local_26c0;
          uStack_a18 = uStack_26b8;
          uStack_a10 = uStack_26b0;
          uStack_a08 = uStack_26a8;
          local_24e0 = vpblendvb_avx2(local_24e0,local_a00,auVar13);
          auVar12 = local_a00;
          for (local_1fc0 = 0; (int)local_1fc0 < local_1fe4 + -2; local_1fc0 = local_1fc0 + 1) {
            auVar13 = vperm2i128_avx2(auVar12,local_2440,0x28);
            auVar12 = vpalignr_avx2(local_2440,auVar13,0xe);
            auVar11 = vperm2i128_avx2(auVar13,local_24a0,0x28);
            auVar13 = vpalignr_avx2(local_24a0,auVar11,0xe);
            auVar6 = vperm2i128_avx2(auVar11,local_24c0,0x28);
            auVar11 = vpalignr_avx2(local_24c0,auVar6,0xe);
            auVar6 = vperm2i128_avx2(auVar6,local_24e0,0x28);
            auVar6 = vpalignr_avx2(local_24e0,auVar6,0xe);
            local_2740 = auVar12._0_8_;
            local_1e80 = local_2740;
            uStack_2738 = auVar12._8_8_;
            uStack_1e78 = uStack_2738;
            uStack_2730 = auVar12._16_8_;
            uStack_1e70 = uStack_2730;
            uStack_2728 = auVar12._24_8_;
            uStack_1e68 = uStack_2728;
            local_1ea0 = local_2200._0_8_;
            uStack_1e98 = local_2200._8_8_;
            uStack_1e90 = local_2200._16_8_;
            uStack_1e88 = local_2200._24_8_;
            auVar12 = vpaddsw_avx2(auVar12,local_2200);
            local_2740 = auVar12._0_8_;
            local_1420 = local_2740;
            uStack_2738 = auVar12._8_8_;
            uStack_1418 = uStack_2738;
            uStack_2730 = auVar12._16_8_;
            uStack_1410 = uStack_2730;
            uStack_2728 = auVar12._24_8_;
            uStack_1408 = uStack_2728;
            local_1440 = local_2440._0_8_;
            uStack_1438 = local_2440._8_8_;
            uStack_1430 = local_2440._16_8_;
            uStack_1428 = local_2440._24_8_;
            local_540 = vpcmpgtw_avx2(auVar12,local_2440);
            local_400 = local_2740;
            uStack_3f8 = uStack_2738;
            uStack_3f0 = uStack_2730;
            uStack_3e8 = uStack_2728;
            local_420 = local_2440._0_8_;
            uStack_418 = local_2440._8_8_;
            uStack_410 = local_2440._16_8_;
            uStack_408 = local_2440._24_8_;
            local_560 = vpcmpeqw_avx2(auVar12,local_2440);
            auVar7 = vpor_avx2(local_540,local_560);
            local_10e0 = local_2440._0_8_;
            uStack_10d8 = local_2440._8_8_;
            uStack_10d0 = local_2440._16_8_;
            uStack_10c8 = local_2440._24_8_;
            local_1100 = local_2740;
            uStack_10f8 = uStack_2738;
            uStack_10f0 = uStack_2730;
            uStack_10e8 = uStack_2728;
            local_2440 = vpmaxsw_avx2(local_2440,auVar12);
            local_a40 = local_24a0._0_8_;
            uStack_a38 = local_24a0._8_8_;
            uStack_a30 = local_24a0._16_8_;
            uStack_a28 = local_24a0._24_8_;
            local_2760 = auVar13._0_8_;
            local_a60 = local_2760;
            uStack_2758 = auVar13._8_8_;
            uStack_a58 = uStack_2758;
            uStack_2750 = auVar13._16_8_;
            uStack_a50 = uStack_2750;
            uStack_2748 = auVar13._24_8_;
            uStack_a48 = uStack_2748;
            local_26c0 = auVar7._0_8_;
            local_a80 = local_26c0;
            uStack_26b8 = auVar7._8_8_;
            uStack_a78 = uStack_26b8;
            uStack_26b0 = auVar7._16_8_;
            uStack_a70 = uStack_26b0;
            uStack_26a8 = auVar7._24_8_;
            uStack_a68 = uStack_26a8;
            local_24a0 = vpblendvb_avx2(local_24a0,auVar13,auVar7);
            local_aa0 = local_24c0._0_8_;
            uStack_a98 = local_24c0._8_8_;
            uStack_a90 = local_24c0._16_8_;
            uStack_a88 = local_24c0._24_8_;
            local_2780 = auVar11._0_8_;
            local_ac0 = local_2780;
            uStack_2778 = auVar11._8_8_;
            uStack_ab8 = uStack_2778;
            uStack_2770 = auVar11._16_8_;
            uStack_ab0 = uStack_2770;
            uStack_2768 = auVar11._24_8_;
            uStack_aa8 = uStack_2768;
            local_ae0 = local_26c0;
            uStack_ad8 = uStack_26b8;
            uStack_ad0 = uStack_26b0;
            uStack_ac8 = uStack_26a8;
            local_24c0 = vpblendvb_avx2(local_24c0,auVar11,auVar7);
            local_b00 = local_24e0._0_8_;
            uStack_af8 = local_24e0._8_8_;
            uStack_af0 = local_24e0._16_8_;
            uStack_ae8 = local_24e0._24_8_;
            local_27a0 = auVar6._0_8_;
            local_1ec0 = local_27a0;
            uStack_2798 = auVar6._8_8_;
            uStack_1eb8 = uStack_2798;
            uStack_2790 = auVar6._16_8_;
            uStack_1eb0 = uStack_2790;
            uStack_2788 = auVar6._24_8_;
            uStack_1ea8 = uStack_2788;
            local_1ee0 = local_2220._0_8_;
            uStack_1ed8 = local_2220._8_8_;
            uStack_1ed0 = local_2220._16_8_;
            uStack_1ec8 = local_2220._24_8_;
            auVar12 = vpaddsw_avx2(auVar6,local_2220);
            local_b40 = local_26c0;
            uStack_b38 = uStack_26b8;
            uStack_b30 = uStack_26b0;
            uStack_b28 = uStack_26a8;
            local_24e0 = vpblendvb_avx2(local_24e0,auVar12,auVar7);
            local_b20 = auVar12;
          }
          auVar13 = vperm2i128_avx2(auVar12,local_2440,0x28);
          auVar12 = vpalignr_avx2(local_2440,auVar13,0xe);
          auVar13 = vperm2i128_avx2(auVar13,local_24a0,0x28);
          local_24a0 = vpalignr_avx2(local_24a0,auVar13,0xe);
          auVar13 = vperm2i128_avx2(auVar13,local_24c0,0x28);
          local_24c0 = vpalignr_avx2(local_24c0,auVar13,0xe);
          auVar13 = vperm2i128_avx2(auVar13,local_24e0,0x28);
          auVar7 = vpalignr_avx2(local_24e0,auVar13,0xe);
          local_2440._0_8_ = auVar12._0_8_;
          local_1f00 = local_2440._0_8_;
          local_2440._8_8_ = auVar12._8_8_;
          uStack_1ef8 = local_2440._8_8_;
          local_2440._16_8_ = auVar12._16_8_;
          uStack_1ef0 = local_2440._16_8_;
          local_2440._24_8_ = auVar12._24_8_;
          uStack_1ee8 = local_2440._24_8_;
          local_1f20 = local_21e0._0_8_;
          uStack_1f18 = local_21e0._8_8_;
          uStack_1f10 = local_21e0._16_8_;
          uStack_1f08 = local_21e0._24_8_;
          local_2440 = vpaddsw_avx2(auVar12,local_21e0);
          local_1460 = local_2440._0_8_;
          uStack_1458 = local_2440._8_8_;
          uStack_1450 = local_2440._16_8_;
          uStack_1448 = local_2440._24_8_;
          local_1480 = local_23c0;
          uStack_1478 = uStack_23b8;
          uStack_1470 = uStack_23b0;
          uStack_1468 = uStack_23a8;
          auVar28._8_8_ = uStack_23b8;
          auVar28._0_8_ = local_23c0;
          auVar28._16_8_ = uStack_23b0;
          auVar28._24_8_ = uStack_23a8;
          auVar12 = vpcmpgtw_avx2(local_2440,auVar28);
          local_1120 = local_2440._0_8_;
          uStack_1118 = local_2440._8_8_;
          uStack_1110 = local_2440._16_8_;
          uStack_1108 = local_2440._24_8_;
          local_1140 = local_23c0;
          uStack_1138 = uStack_23b8;
          uStack_1130 = uStack_23b0;
          uStack_1128 = uStack_23a8;
          auVar29._8_8_ = uStack_23b8;
          auVar29._0_8_ = local_23c0;
          auVar29._16_8_ = uStack_23b0;
          auVar29._24_8_ = uStack_23a8;
          local_2500 = vpmaxsw_avx2(local_2440,auVar29);
          local_b60 = local_23e0._0_8_;
          uStack_b58 = local_23e0._8_8_;
          uStack_b50 = local_23e0._16_8_;
          uStack_b48 = local_23e0._24_8_;
          local_b80 = local_24a0._0_8_;
          uStack_b78 = local_24a0._8_8_;
          uStack_b70 = local_24a0._16_8_;
          uStack_b68 = local_24a0._24_8_;
          local_26c0 = auVar12._0_8_;
          local_ba0 = local_26c0;
          uStack_26b8 = auVar12._8_8_;
          uStack_b98 = uStack_26b8;
          uStack_26b0 = auVar12._16_8_;
          uStack_b90 = uStack_26b0;
          uStack_26a8 = auVar12._24_8_;
          uStack_b88 = uStack_26a8;
          local_2520 = vpblendvb_avx2(local_23e0,local_24a0,auVar12);
          local_bc0 = local_2400._0_8_;
          uStack_bb8 = local_2400._8_8_;
          uStack_bb0 = local_2400._16_8_;
          uStack_ba8 = local_2400._24_8_;
          local_be0 = local_24c0._0_8_;
          uStack_bd8 = local_24c0._8_8_;
          uStack_bd0 = local_24c0._16_8_;
          uStack_bc8 = local_24c0._24_8_;
          local_c00 = local_26c0;
          uStack_bf8 = uStack_26b8;
          uStack_bf0 = uStack_26b0;
          uStack_be8 = uStack_26a8;
          local_2540 = vpblendvb_avx2(local_2400,local_24c0,auVar12);
          local_c20 = local_2420._0_8_;
          uStack_c18 = local_2420._8_8_;
          uStack_c10 = local_2420._16_8_;
          uStack_c08 = local_2420._24_8_;
          local_24e0._0_8_ = auVar7._0_8_;
          local_c40 = local_24e0._0_8_;
          local_24e0._8_8_ = auVar7._8_8_;
          uStack_c38 = local_24e0._8_8_;
          local_24e0._16_8_ = auVar7._16_8_;
          uStack_c30 = local_24e0._16_8_;
          local_24e0._24_8_ = auVar7._24_8_;
          uStack_c28 = local_24e0._24_8_;
          local_c60 = local_26c0;
          uStack_c58 = uStack_26b8;
          uStack_c50 = uStack_26b0;
          uStack_c48 = uStack_26a8;
          local_2560 = vpblendvb_avx2(local_2420,auVar7,auVar12);
          local_24e0 = auVar7;
          for (local_1fc0 = 0; (int)local_1fc0 < (int)local_1fe8; local_1fc0 = local_1fc0 + 1) {
            local_15e0 = local_2030 + (int)local_1fc0;
            auVar30 = *(undefined1 (*) [24])*local_15e0;
            lStack_1188 = (*local_15e0)[3];
            local_15e8 = local_2038 + (int)local_1fc0;
            auVar31 = *(undefined1 (*) [24])*local_15e8;
            lStack_e08 = (*local_15e8)[3];
            local_15f0 = local_2040 + (int)local_1fc0;
            auVar32 = *(undefined1 (*) [24])*local_15f0;
            lStack_ec8 = (*local_15f0)[3];
            local_15f8 = local_2048 + (int)local_1fc0;
            auVar33 = *(undefined1 (*) [24])*local_15f8;
            lStack_f88 = (*local_15f8)[3];
            local_1600 = local_2010 + (int)local_1fc0;
            auVar34 = *(undefined1 (*) [24])*local_1600;
            lStack_11a8 = (*local_1600)[3];
            local_1608 = local_2018 + (int)local_1fc0;
            auVar35 = *(undefined1 (*) [24])*local_1608;
            lStack_d88 = (*local_1608)[3];
            local_1610 = local_2020 + (int)local_1fc0;
            auVar36 = *(undefined1 (*) [24])*local_1610;
            lStack_e48 = (*local_1610)[3];
            local_1618 = local_2028 + (int)local_1fc0;
            auVar37 = *(undefined1 (*) [24])*local_1618;
            lStack_f08 = (*local_1618)[3];
            local_1b40 = local_2500._0_8_;
            uStack_1b38 = local_2500._8_8_;
            uStack_1b30 = local_2500._16_8_;
            uStack_1b28 = local_2500._24_8_;
            local_1b60 = local_20a0;
            uStack_1b58 = uStack_2098;
            uStack_1b50 = uStack_2090;
            uStack_1b48 = uStack_2088;
            auVar23._8_8_ = uStack_2098;
            auVar23._0_8_ = local_20a0;
            auVar23._16_8_ = uStack_2090;
            auVar23._24_8_ = uStack_2088;
            auVar12 = vpsubsw_avx2(local_2500,auVar23);
            local_1b80 = local_2440._0_8_;
            uStack_1b78 = local_2440._8_8_;
            uStack_1b70 = local_2440._16_8_;
            uStack_1b68 = local_2440._24_8_;
            uStack_1b90 = auStack_20b0._0_8_;
            uStack_1b88 = auStack_20b0._8_8_;
            auVar22._16_8_ = auStack_20b0._0_8_;
            auVar22._0_16_ = local_20c0;
            auVar22._24_8_ = auStack_20b0._8_8_;
            auVar13 = vpsubsw_avx2(local_2440,auVar22);
            local_2480 = auVar12._0_8_;
            local_1160 = local_2480;
            uStack_2478 = auVar12._8_8_;
            uStack_1158 = uStack_2478;
            uStack_2470 = auVar12._16_8_;
            uStack_1150 = uStack_2470;
            uStack_2468 = auVar12._24_8_;
            uStack_1148 = uStack_2468;
            local_2460 = auVar13._0_8_;
            local_1180 = local_2460;
            uStack_2458 = auVar13._8_8_;
            uStack_1178 = uStack_2458;
            uStack_2450 = auVar13._16_8_;
            uStack_1170 = uStack_2450;
            uStack_2448 = auVar13._24_8_;
            uStack_1168 = uStack_2448;
            local_2440 = vpmaxsw_avx2(auVar12,auVar13);
            local_14a0 = local_2480;
            uStack_1498 = uStack_2478;
            uStack_1490 = uStack_2470;
            uStack_1488 = uStack_2468;
            local_14c0 = local_2460;
            uStack_14b8 = uStack_2458;
            uStack_14b0 = uStack_2450;
            uStack_14a8 = uStack_2448;
            auVar12 = vpcmpgtw_avx2(auVar12,auVar13);
            local_c80 = local_24a0._0_8_;
            uStack_c78 = local_24a0._8_8_;
            uStack_c70 = local_24a0._16_8_;
            uStack_c68 = local_24a0._24_8_;
            local_ca0 = local_2520._0_8_;
            uStack_c98 = local_2520._8_8_;
            uStack_c90 = local_2520._16_8_;
            uStack_c88 = local_2520._24_8_;
            local_26c0 = auVar12._0_8_;
            local_cc0 = local_26c0;
            uStack_26b8 = auVar12._8_8_;
            uStack_cb8 = uStack_26b8;
            uStack_26b0 = auVar12._16_8_;
            uStack_cb0 = uStack_26b0;
            uStack_26a8 = auVar12._24_8_;
            uStack_ca8 = uStack_26a8;
            local_24a0 = vpblendvb_avx2(local_24a0,local_2520,auVar12);
            local_ce0 = local_24c0._0_8_;
            uStack_cd8 = local_24c0._8_8_;
            uStack_cd0 = local_24c0._16_8_;
            uStack_cc8 = local_24c0._24_8_;
            local_d00 = local_2540._0_8_;
            uStack_cf8 = local_2540._8_8_;
            uStack_cf0 = local_2540._16_8_;
            uStack_ce8 = local_2540._24_8_;
            local_d20 = local_26c0;
            uStack_d18 = uStack_26b8;
            uStack_d10 = uStack_26b0;
            uStack_d08 = uStack_26a8;
            local_24c0 = vpblendvb_avx2(local_24c0,local_2540,auVar12);
            local_d40 = local_24e0._0_8_;
            uStack_d38 = local_24e0._8_8_;
            uStack_d30 = local_24e0._16_8_;
            uStack_d28 = local_24e0._24_8_;
            local_d60 = local_2560._0_8_;
            uStack_d58 = local_2560._8_8_;
            uStack_d50 = local_2560._16_8_;
            uStack_d48 = local_2560._24_8_;
            local_d80 = local_26c0;
            uStack_d78 = uStack_26b8;
            uStack_d70 = uStack_26b0;
            uStack_d68 = uStack_26a8;
            auVar12 = vpblendvb_avx2(local_24e0,local_2560,auVar12);
            local_24e0._0_8_ = auVar12._0_8_;
            local_1f40 = local_24e0._0_8_;
            local_24e0._8_8_ = auVar12._8_8_;
            uStack_1f38 = local_24e0._8_8_;
            local_24e0._16_8_ = auVar12._16_8_;
            uStack_1f30 = local_24e0._16_8_;
            local_24e0._24_8_ = auVar12._24_8_;
            uStack_1f28 = local_24e0._24_8_;
            local_1f60 = local_2120;
            uStack_1f58 = uStack_2118;
            uStack_1f50 = uStack_2110;
            uStack_1f48 = uStack_2108;
            auVar18._8_8_ = uStack_2118;
            auVar18._0_8_ = local_2120;
            auVar18._16_8_ = uStack_2110;
            auVar18._24_8_ = uStack_2108;
            local_24e0 = vpaddsw_avx2(auVar12,auVar18);
            local_2580[0] = auVar30._0_8_;
            local_11a0 = local_2580[0];
            local_2580[1] = auVar30._8_8_;
            uStack_1198 = local_2580[1];
            local_2580[2] = auVar30._16_8_;
            uStack_1190 = local_2580[2];
            local_2300 = auVar34._0_8_;
            local_11c0 = local_2300;
            lStack_22f8 = auVar34._8_8_;
            uStack_11b8 = lStack_22f8;
            lStack_22f0 = auVar34._16_8_;
            uStack_11b0 = lStack_22f0;
            auVar12 = vpmaxsw_avx2((undefined1  [32])*local_15e0,(undefined1  [32])*local_1600);
            local_2500._0_8_ = auVar12._0_8_;
            local_11e0 = local_2500._0_8_;
            local_2500._8_8_ = auVar12._8_8_;
            uStack_11d8 = local_2500._8_8_;
            local_2500._16_8_ = auVar12._16_8_;
            uStack_11d0 = local_2500._16_8_;
            local_2500._24_8_ = auVar12._24_8_;
            uStack_11c8 = local_2500._24_8_;
            local_1200 = local_2440._0_8_;
            uStack_11f8 = local_2440._8_8_;
            uStack_11f0 = local_2440._16_8_;
            uStack_11e8 = local_2440._24_8_;
            local_2500 = vpmaxsw_avx2(auVar12,local_2440);
            local_440 = local_2500._0_8_;
            lStack_438 = local_2500._8_8_;
            lStack_430 = local_2500._16_8_;
            lStack_428 = local_2500._24_8_;
            local_460 = local_2580[0];
            uStack_458 = local_2580[1];
            uStack_450 = local_2580[2];
            auVar12 = vpcmpeqw_avx2(local_2500,(undefined1  [32])*local_15e0);
            local_480 = local_2500._0_8_;
            lStack_478 = local_2500._8_8_;
            lStack_470 = local_2500._16_8_;
            lStack_468 = local_2500._24_8_;
            local_4a0 = local_2440._0_8_;
            uStack_498 = local_2440._8_8_;
            uStack_490 = local_2440._16_8_;
            uStack_488 = local_2440._24_8_;
            auVar13 = vpcmpeqw_avx2(local_2500,local_2440);
            local_2360 = auVar35._0_8_;
            local_da0 = local_2360;
            lStack_2358 = auVar35._8_8_;
            uStack_d98 = lStack_2358;
            lStack_2350 = auVar35._16_8_;
            uStack_d90 = lStack_2350;
            local_dc0 = local_24a0._0_8_;
            uStack_db8 = local_24a0._8_8_;
            uStack_db0 = local_24a0._16_8_;
            uStack_da8 = local_24a0._24_8_;
            local_26e0 = auVar13._0_8_;
            local_de0 = local_26e0;
            uStack_26d8 = auVar13._8_8_;
            uStack_dd8 = uStack_26d8;
            uStack_26d0 = auVar13._16_8_;
            uStack_dd0 = uStack_26d0;
            uStack_26c8 = auVar13._24_8_;
            uStack_dc8 = uStack_26c8;
            local_e00 = vpblendvb_avx2((undefined1  [32])*local_1608,local_24a0,auVar13);
            local_25a0[0] = auVar31._0_8_;
            local_e20 = local_25a0[0];
            local_25a0[1] = auVar31._8_8_;
            uStack_e18 = local_25a0[1];
            local_25a0[2] = auVar31._16_8_;
            uStack_e10 = local_25a0[2];
            local_26c0 = auVar12._0_8_;
            local_e40 = local_26c0;
            uStack_26b8 = auVar12._8_8_;
            uStack_e38 = uStack_26b8;
            uStack_26b0 = auVar12._16_8_;
            uStack_e30 = uStack_26b0;
            uStack_26a8 = auVar12._24_8_;
            uStack_e28 = uStack_26a8;
            local_2520 = vpblendvb_avx2(local_e00,(undefined1  [32])*local_15e8,auVar12);
            local_2380 = auVar36._0_8_;
            local_e60 = local_2380;
            lStack_2378 = auVar36._8_8_;
            uStack_e58 = lStack_2378;
            lStack_2370 = auVar36._16_8_;
            uStack_e50 = lStack_2370;
            local_e80 = local_24c0._0_8_;
            uStack_e78 = local_24c0._8_8_;
            uStack_e70 = local_24c0._16_8_;
            uStack_e68 = local_24c0._24_8_;
            local_ea0 = local_26e0;
            uStack_e98 = uStack_26d8;
            uStack_e90 = uStack_26d0;
            uStack_e88 = uStack_26c8;
            local_ec0 = vpblendvb_avx2((undefined1  [32])*local_1610,local_24c0,auVar13);
            local_25c0[0] = auVar32._0_8_;
            local_ee0 = local_25c0[0];
            local_25c0[1] = auVar32._8_8_;
            uStack_ed8 = local_25c0[1];
            local_25c0[2] = auVar32._16_8_;
            uStack_ed0 = local_25c0[2];
            local_f00 = local_26c0;
            uStack_ef8 = uStack_26b8;
            uStack_ef0 = uStack_26b0;
            uStack_ee8 = uStack_26a8;
            local_2540 = vpblendvb_avx2(local_ec0,(undefined1  [32])*local_15f0,auVar12);
            local_23a0 = auVar37._0_8_;
            local_f20 = local_23a0;
            lStack_2398 = auVar37._8_8_;
            uStack_f18 = lStack_2398;
            lStack_2390 = auVar37._16_8_;
            uStack_f10 = lStack_2390;
            local_f40 = local_24e0._0_8_;
            uStack_f38 = local_24e0._8_8_;
            uStack_f30 = local_24e0._16_8_;
            uStack_f28 = local_24e0._24_8_;
            local_f60 = local_26e0;
            uStack_f58 = uStack_26d8;
            uStack_f50 = uStack_26d0;
            uStack_f48 = uStack_26c8;
            local_f80 = vpblendvb_avx2((undefined1  [32])*local_1618,local_24e0,auVar13);
            local_25e0[0] = auVar33._0_8_;
            local_fa0 = local_25e0[0];
            local_25e0[1] = auVar33._8_8_;
            uStack_f98 = local_25e0[1];
            local_25e0[2] = auVar33._16_8_;
            uStack_f90 = local_25e0[2];
            local_fc0 = local_26c0;
            uStack_fb8 = uStack_26b8;
            uStack_fb0 = uStack_26b0;
            uStack_fa8 = uStack_26a8;
            auVar7 = vpblendvb_avx2(local_f80,(undefined1  [32])*local_15f8,auVar12);
            local_18e8 = local_2030 + (int)local_1fc0;
            local_1920 = local_2500._0_8_;
            lStack_1918 = local_2500._8_8_;
            lStack_1910 = local_2500._16_8_;
            lStack_1908 = local_2500._24_8_;
            (*local_18e8)[0] = local_2500._0_8_;
            (*local_18e8)[1] = local_2500._8_8_;
            (*local_18e8)[2] = local_2500._16_8_;
            (*local_18e8)[3] = local_2500._24_8_;
            local_1928 = local_2038 + (int)local_1fc0;
            local_1960 = local_2520._0_8_;
            lStack_1958 = local_2520._8_8_;
            lStack_1950 = local_2520._16_8_;
            lStack_1948 = local_2520._24_8_;
            (*local_1928)[0] = local_2520._0_8_;
            (*local_1928)[1] = local_2520._8_8_;
            (*local_1928)[2] = local_2520._16_8_;
            (*local_1928)[3] = local_2520._24_8_;
            local_1968 = local_2040 + (int)local_1fc0;
            local_19a0 = local_2540._0_8_;
            lStack_1998 = local_2540._8_8_;
            lStack_1990 = local_2540._16_8_;
            lStack_1988 = local_2540._24_8_;
            (*local_1968)[0] = local_2540._0_8_;
            (*local_1968)[1] = local_2540._8_8_;
            (*local_1968)[2] = local_2540._16_8_;
            (*local_1968)[3] = local_2540._24_8_;
            local_19a8 = local_2048 + (int)local_1fc0;
            local_2560._0_8_ = auVar7._0_8_;
            local_19e0 = local_2560._0_8_;
            local_2560._8_8_ = auVar7._8_8_;
            lStack_19d8 = local_2560._8_8_;
            local_2560._16_8_ = auVar7._16_8_;
            lStack_19d0 = local_2560._16_8_;
            local_2560._24_8_ = auVar7._24_8_;
            lStack_19c8 = local_2560._24_8_;
            (*local_19a8)[0] = local_2560._0_8_;
            (*local_19a8)[1] = local_2560._8_8_;
            (*local_19a8)[2] = local_2560._16_8_;
            (*local_19a8)[3] = local_2560._24_8_;
            local_340 = local_21a0._0_8_;
            uStack_338 = local_21a0._8_8_;
            uStack_330 = local_21a0._16_8_;
            uStack_328 = local_21a0._24_8_;
            local_360 = local_2500._0_8_;
            lStack_358 = local_2500._8_8_;
            lStack_350 = local_2500._16_8_;
            lStack_348 = local_2500._24_8_;
            local_21a0 = vpminsw_avx2(local_21a0,local_2500);
            local_1220 = local_21c0._0_8_;
            uStack_1218 = local_21c0._8_8_;
            uStack_1210 = local_21c0._16_8_;
            uStack_1208 = local_21c0._24_8_;
            local_1240 = local_2500._0_8_;
            lStack_1238 = local_2500._8_8_;
            lStack_1230 = local_2500._16_8_;
            lStack_1228 = local_2500._24_8_;
            auVar12 = vpmaxsw_avx2(local_21c0,local_2500);
            local_21c0._0_8_ = auVar12._0_8_;
            local_1260 = local_21c0._0_8_;
            local_21c0._8_8_ = auVar12._8_8_;
            uStack_1258 = local_21c0._8_8_;
            local_21c0._16_8_ = auVar12._16_8_;
            uStack_1250 = local_21c0._16_8_;
            local_21c0._24_8_ = auVar12._24_8_;
            uStack_1248 = local_21c0._24_8_;
            local_1280 = local_2520._0_8_;
            lStack_1278 = local_2520._8_8_;
            lStack_1270 = local_2520._16_8_;
            lStack_1268 = local_2520._24_8_;
            auVar12 = vpmaxsw_avx2(auVar12,local_2520);
            local_21c0._0_8_ = auVar12._0_8_;
            local_12a0 = local_21c0._0_8_;
            local_21c0._8_8_ = auVar12._8_8_;
            uStack_1298 = local_21c0._8_8_;
            local_21c0._16_8_ = auVar12._16_8_;
            uStack_1290 = local_21c0._16_8_;
            local_21c0._24_8_ = auVar12._24_8_;
            uStack_1288 = local_21c0._24_8_;
            local_12c0 = local_2540._0_8_;
            lStack_12b8 = local_2540._8_8_;
            lStack_12b0 = local_2540._16_8_;
            lStack_12a8 = local_2540._24_8_;
            auVar12 = vpmaxsw_avx2(auVar12,local_2540);
            local_21c0._0_8_ = auVar12._0_8_;
            local_12e0 = local_21c0._0_8_;
            local_21c0._8_8_ = auVar12._8_8_;
            uStack_12d8 = local_21c0._8_8_;
            local_21c0._16_8_ = auVar12._16_8_;
            uStack_12d0 = local_21c0._16_8_;
            local_21c0._24_8_ = auVar12._24_8_;
            uStack_12c8 = local_21c0._24_8_;
            local_1300 = local_2560._0_8_;
            lStack_12f8 = local_2560._8_8_;
            lStack_12f0 = local_2560._16_8_;
            lStack_12e8 = local_2560._24_8_;
            local_21c0 = vpmaxsw_avx2(auVar12,auVar7);
            local_2560 = auVar7;
            lStack_448 = lStack_1188;
            local_1ba0 = local_20c0;
          }
        }
        local_1620 = local_2030 + local_1fec;
        local_27c0 = *(undefined1 (*) [32])local_1620;
        local_1628 = local_2038 + local_1fec;
        local_27e0 = *(undefined1 (*) [32])local_1628;
        local_1630 = local_2040 + local_1fec;
        local_2800 = *(undefined1 (*) [32])local_1630;
        local_1638 = local_2048 + local_1fec;
        _local_2820 = *local_1638;
        for (local_1fc8 = 0; local_1fc8 < local_1ff0; local_1fc8 = local_1fc8 + 1) {
          auVar12 = vperm2i128_avx2(auVar7,local_27c0,0x28);
          local_27c0 = vpalignr_avx2(local_27c0,auVar12,0xe);
          auVar12 = vperm2i128_avx2(auVar12,local_27e0,0x28);
          local_27e0 = vpalignr_avx2(local_27e0,auVar12,0xe);
          auVar12 = vperm2i128_avx2(auVar12,local_2800,0x28);
          local_2800 = vpalignr_avx2(local_2800,auVar12,0xe);
          auVar7 = vperm2i128_avx2(auVar12,(undefined1  [32])_local_2820,0x28);
          _local_2820 = (__m256i)vpalignr_avx2((undefined1  [32])_local_2820,auVar7,0xe);
        }
        local_2122 = local_27c0._30_2_;
        local_2124 = local_27e0._30_2_;
        local_2126 = local_2800._30_2_;
        local_2128 = sStack_2802;
        local_14e0 = local_2160;
        uStack_14d8 = uStack_2158;
        uStack_14d0 = uStack_2150;
        uStack_14c8 = uStack_2148;
        local_1500 = local_21a0._0_8_;
        uStack_14f8 = local_21a0._8_8_;
        uStack_14f0 = local_21a0._16_8_;
        uStack_14e8 = local_21a0._24_8_;
        auVar27._8_8_ = uStack_2158;
        auVar27._0_8_ = local_2160;
        auVar27._16_8_ = uStack_2150;
        auVar27._24_8_ = uStack_2148;
        local_580 = vpcmpgtw_avx2(auVar27,local_21a0);
        local_1520 = local_21c0._0_8_;
        uStack_1518 = local_21c0._8_8_;
        uStack_1510 = local_21c0._16_8_;
        uStack_1508 = local_21c0._24_8_;
        local_1540 = local_2180;
        uStack_1538 = uStack_2178;
        uStack_1530 = uStack_2170;
        uStack_1528 = uStack_2168;
        auVar26._8_8_ = uStack_2178;
        auVar26._0_8_ = local_2180;
        auVar26._16_8_ = uStack_2170;
        auVar26._24_8_ = uStack_2168;
        local_5a0 = vpcmpgtw_avx2(local_21c0,auVar26);
        local_320 = vpor_avx2(local_580,local_5a0);
        if ((((((((((((((((((((((((((((((((local_320 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_320 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_320 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_320 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_320 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_320 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_320 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_320 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_320 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_320 >> 0x4f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_320 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_320 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_320 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (local_320 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             ) || (local_320 >> 0x77 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(local_320 >> 0x7f,0) != '\0') ||
                          (local_320 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_320 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_320 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_320 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_320 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_320 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_320 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_320 >> 0xbf,0) != '\0') ||
                  (local_320 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_320 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_320 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_320 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_320 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_320 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_320 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_320[0x1f] < '\0') {
          local_2228->flag = local_2228->flag | 0x40;
          local_2122 = 0;
          local_2124 = 0;
          local_2126 = 0;
          local_2128 = 0;
          local_1fd0 = 0;
          local_1fd4 = 0;
        }
        local_2228->score = (int)(short)local_2122;
        local_2228->end_query = local_1fd0;
        local_2228->end_ref = local_1fd4;
        *(int *)(local_2228->field_4).extra = (int)local_2124;
        ((local_2228->field_4).stats)->similar = (int)local_2126;
        ((local_2228->field_4).stats)->length = (int)local_2128;
        parasail_free(local_2080);
        parasail_free(local_2078);
        parasail_free(local_2070);
        parasail_free(local_2068);
        parasail_free(local_2060);
        parasail_free(local_2058);
        parasail_free(local_2050);
        parasail_free(local_2048);
        parasail_free(local_2040);
        parasail_free(local_2038);
        parasail_free(local_2030);
        parasail_free(local_2028);
        parasail_free(local_2020);
        parasail_free(local_2018);
        parasail_free(local_2010);
        local_1fa0 = local_2228;
      }
    }
  }
  return local_1fa0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile16.score;
    pvPm = (__m256i*)profile->profile16.matches;
    pvPs = (__m256i*)profile->profile16.similar;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi16(segLen), 2);
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            vGapperL = _mm256_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHpM = _mm256_slli_si256_rpl(vHpM, 2);
        vHpS = _mm256_slli_si256_rpl(vHpS, 2);
        vHpL = _mm256_slli_si256_rpl(vHpL, 2);
        vHp = _mm256_insert_epi16_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi16(vH, vGapO);
            vE_ext = _mm256_subs_epi16(vE, vGapE);
            case1 = _mm256_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm256_max_epi16(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi16(vEL, vOne);
            vGapper = _mm256_adds_epi16(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vF, vGapper),
                    _mm256_cmpeq_epi16(vF, vGapper));
            vF = _mm256_max_epi16(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi16(vHp, vW);
            vHpM = _mm256_adds_epi16(vHpM, vWM);
            vHpS = _mm256_adds_epi16(vHpS, vWS);
            vHpL = _mm256_adds_epi16(vHpL, vOne);
            case1 = _mm256_cmpgt_epi16(vE, vHp);
            vHt = _mm256_max_epi16(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHtM = _mm256_slli_si256_rpl(vHtM, 2);
        vHtS = _mm256_slli_si256_rpl(vHtS, 2);
        vHtL = _mm256_slli_si256_rpl(vHtL, 2);
        vHt = _mm256_insert_epi16_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi16(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi16(vGapper, vF),
                _mm256_cmpeq_epi16(vGapper, vF));
        vF = _mm256_max_epi16(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 2);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 2);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vFt, vF),
                    _mm256_cmpeq_epi16(vFt, vF));
            vF = _mm256_max_epi16(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vFM = _mm256_slli_si256_rpl(vFM, 2);
        vFS = _mm256_slli_si256_rpl(vFS, 2);
        vFL = _mm256_slli_si256_rpl(vFL, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi16(vF, vHt);
        vH = _mm256_max_epi16(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi16(vH, vGapO);
            vF_ext = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi16(vFL, vOne);
            vH = _mm256_max_epi16(vHp, vE);
            vH = _mm256_max_epi16(vH, vF);
            case1 = _mm256_cmpeq_epi16(vH, vHp);
            case2 = _mm256_cmpeq_epi16(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
                vHM = _mm256_slli_si256_rpl(vHM, 2);
                vHS = _mm256_slli_si256_rpl(vHS, 2);
                vHL = _mm256_slli_si256_rpl(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
            result->stats->rowcols->length_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 2);
            vHM = _mm256_slli_si256_rpl(vHM, 2);
            vHS = _mm256_slli_si256_rpl(vHS, 2);
            vHL = _mm256_slli_si256_rpl(vHL, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        matches = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
        similar = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
        length = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}